

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  int iVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  ulong uVar18;
  undefined8 uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  byte bVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  ulong uVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  Geometry *pGVar62;
  byte bVar63;
  ulong uVar64;
  float fVar65;
  float fVar66;
  float fVar128;
  float fVar130;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar129;
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar132;
  float fVar135;
  float fVar136;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined4 uVar137;
  vint4 bi_2;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined8 uVar145;
  vint4 bi_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar165;
  vint4 bi;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  vint4 ai;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  vint4 ai_1;
  undefined1 auVar187 [16];
  vint4 ai_2;
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  float fVar192;
  float fVar193;
  undefined1 auVar191 [16];
  float fVar194;
  float fVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_53c;
  long local_538;
  ulong local_530;
  ulong local_528;
  Primitive *local_520;
  Precalculations *local_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [16];
  ulong local_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_518 = pre;
  uVar64 = (ulong)(byte)prim[1];
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  lVar59 = uVar64 * 0x25;
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x11 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  fVar153 = *(float *)(prim + lVar59 + 0x12);
  auVar72._4_4_ = fVar153;
  auVar72._0_4_ = fVar153;
  auVar72._8_4_ = fVar153;
  auVar72._12_4_ = fVar153;
  auVar70 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar59 + 6));
  fVar192 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar59 + 0x16)) *
            *(float *)(prim + lVar59 + 0x1a);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar87 = vpmovsxwd_avx(auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar212 = vpmovsxwd_avx(auVar81);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar7);
  auVar67 = vpbroadcastd_avx512vl();
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar68 = vpmovsxwd_avx512vl(auVar83);
  auVar69 = vmulps_avx512vl(auVar72,(undefined1  [16])(ray->super_RayK<1>).dir.field_0);
  auVar208._0_4_ = fVar153 * auVar70._0_4_;
  auVar208._4_4_ = fVar153 * auVar70._4_4_;
  auVar208._8_4_ = fVar153 * auVar70._8_4_;
  auVar208._12_4_ = fVar153 * auVar70._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar82);
  auVar70 = vcvtdq2ps_avx512vl(auVar75);
  auVar71 = vcvtdq2ps_avx512vl(auVar76);
  auVar72 = vcvtdq2ps_avx512vl(auVar74);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar81 = vcvtdq2ps_avx(auVar77);
  auVar7 = vcvtdq2ps_avx(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar79);
  auVar82 = vcvtdq2ps_avx(auVar80);
  auVar74 = vbroadcastss_avx512vl(auVar69);
  auVar75 = vshufps_avx512vl(auVar69,auVar69,0x55);
  auVar76 = vshufps_avx512vl(auVar69,auVar69,0xaa);
  auVar77 = vmulps_avx512vl(auVar76,auVar71);
  auVar146._0_4_ = auVar76._0_4_ * auVar81._0_4_;
  auVar146._4_4_ = auVar76._4_4_ * auVar81._4_4_;
  auVar146._8_4_ = auVar76._8_4_ * auVar81._8_4_;
  auVar146._12_4_ = auVar76._12_4_ * auVar81._12_4_;
  auVar69._0_4_ = auVar82._0_4_ * auVar76._0_4_;
  auVar69._4_4_ = auVar82._4_4_ * auVar76._4_4_;
  auVar69._8_4_ = auVar82._8_4_ * auVar76._8_4_;
  auVar69._12_4_ = auVar82._12_4_ * auVar76._12_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar77,auVar75,auVar70);
  auVar77 = vfmadd231ps_avx512vl(auVar146,auVar75,auVar73);
  auVar75 = vfmadd231ps_fma(auVar69,auVar83,auVar75);
  auVar76 = vfmadd231ps_fma(auVar76,auVar74,auVar84);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar74,auVar72);
  auVar74 = vfmadd231ps_fma(auVar75,auVar7,auVar74);
  auVar78 = vbroadcastss_avx512vl(auVar208);
  auVar79 = vshufps_avx512vl(auVar208,auVar208,0x55);
  auVar75 = vshufps_avx(auVar208,auVar208,0xaa);
  auVar80 = vmulps_avx512vl(auVar75,auVar71);
  auVar196._0_4_ = auVar75._0_4_ * auVar81._0_4_;
  auVar196._4_4_ = auVar75._4_4_ * auVar81._4_4_;
  auVar196._8_4_ = auVar75._8_4_ * auVar81._8_4_;
  auVar196._12_4_ = auVar75._12_4_ * auVar81._12_4_;
  auVar166._0_4_ = auVar75._0_4_ * auVar82._0_4_;
  auVar166._4_4_ = auVar75._4_4_ * auVar82._4_4_;
  auVar166._8_4_ = auVar75._8_4_ * auVar82._8_4_;
  auVar166._12_4_ = auVar75._12_4_ * auVar82._12_4_;
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar79,auVar70);
  auVar82 = vfmadd231ps_avx512vl(auVar196,auVar79,auVar73);
  auVar83 = vfmadd231ps_avx512vl(auVar166,auVar79,auVar83);
  auVar69 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar84);
  auVar71 = vfmadd231ps_avx512vl(auVar82,auVar78,auVar72);
  auVar72 = vfmadd231ps_avx512vl(auVar83,auVar78,auVar7);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar213 = ZEXT1664(auVar84);
  auVar81 = vandps_avx512vl(auVar76,auVar84);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar81,auVar203,1);
  bVar11 = (bool)((byte)uVar57 & 1);
  auVar70._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar76._0_4_;
  bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar76._4_4_;
  bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar76._8_4_;
  bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar76._12_4_;
  auVar81 = vandps_avx512vl(auVar77,auVar84);
  uVar57 = vcmpps_avx512vl(auVar81,auVar203,1);
  bVar11 = (bool)((byte)uVar57 & 1);
  auVar85._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._0_4_;
  bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._4_4_;
  bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._8_4_;
  bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._12_4_;
  auVar84 = vandps_avx512vl(auVar74,auVar84);
  uVar57 = vcmpps_avx512vl(auVar84,auVar203,1);
  bVar11 = (bool)((byte)uVar57 & 1);
  auVar86._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._0_4_;
  bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._4_4_;
  bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._8_4_;
  bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._12_4_;
  auVar81 = vrcp14ps_avx512vl(auVar70);
  auVar204._8_4_ = 0x3f800000;
  auVar204._0_8_ = 0x3f8000003f800000;
  auVar204._12_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar70,auVar81,auVar204);
  auVar83 = vfmadd132ps_fma(auVar84,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar85);
  auVar84 = vfnmadd213ps_fma(auVar85,auVar81,auVar204);
  auVar80 = vfmadd132ps_fma(auVar84,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar86);
  auVar84 = vfnmadd213ps_fma(auVar86,auVar81,auVar204);
  auVar70 = vfmadd132ps_fma(auVar84,auVar81,auVar81);
  auVar180._4_4_ = fVar192;
  auVar180._0_4_ = fVar192;
  auVar180._8_4_ = fVar192;
  auVar180._12_4_ = fVar192;
  auVar84 = vcvtdq2ps_avx(auVar87);
  auVar81 = vcvtdq2ps_avx(auVar212);
  auVar81 = vsubps_avx(auVar81,auVar84);
  auVar87 = vfmadd213ps_fma(auVar81,auVar180,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar17);
  auVar81 = vcvtdq2ps_avx512vl(auVar68);
  auVar81 = vsubps_avx(auVar81,auVar84);
  auVar212 = vfmadd213ps_fma(auVar81,auVar180,auVar84);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar84 = vpmovsxwd_avx(auVar82);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar64 * 0x16 + 6);
  auVar81 = vpmovsxwd_avx(auVar75);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar84);
  auVar82 = vfmadd213ps_fma(auVar81,auVar180,auVar84);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar64 * 0x14 + 6);
  auVar84 = vpmovsxwd_avx(auVar76);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar81 = vpmovsxwd_avx(auVar74);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar7 = vsubps_avx(auVar81,auVar84);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar81 = vpmovsxwd_avx(auVar73);
  auVar7 = vfmadd213ps_fma(auVar7,auVar180,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar81);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 0x21 + 6);
  auVar81 = vpmovsxwd_avx(auVar77);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar84);
  auVar75 = vfmadd213ps_fma(auVar81,auVar180,auVar84);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar64 * 0x1f + 6);
  auVar84 = vpmovsxwd_avx(auVar78);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar81 = vpmovsxwd_avx(auVar79);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar84);
  auVar81 = vfmadd213ps_fma(auVar81,auVar180,auVar84);
  auVar84 = vsubps_avx(auVar87,auVar69);
  auVar181._0_4_ = auVar83._0_4_ * auVar84._0_4_;
  auVar181._4_4_ = auVar83._4_4_ * auVar84._4_4_;
  auVar181._8_4_ = auVar83._8_4_ * auVar84._8_4_;
  auVar181._12_4_ = auVar83._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar212,auVar69);
  auVar154._0_4_ = auVar83._0_4_ * auVar84._0_4_;
  auVar154._4_4_ = auVar83._4_4_ * auVar84._4_4_;
  auVar154._8_4_ = auVar83._8_4_ * auVar84._8_4_;
  auVar154._12_4_ = auVar83._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar82,auVar71);
  auVar187._0_4_ = auVar80._0_4_ * auVar84._0_4_;
  auVar187._4_4_ = auVar80._4_4_ * auVar84._4_4_;
  auVar187._8_4_ = auVar80._8_4_ * auVar84._8_4_;
  auVar187._12_4_ = auVar80._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar7,auVar71);
  auVar71._0_4_ = auVar80._0_4_ * auVar84._0_4_;
  auVar71._4_4_ = auVar80._4_4_ * auVar84._4_4_;
  auVar71._8_4_ = auVar80._8_4_ * auVar84._8_4_;
  auVar71._12_4_ = auVar80._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar75,auVar72);
  auVar188._0_4_ = auVar70._0_4_ * auVar84._0_4_;
  auVar188._4_4_ = auVar70._4_4_ * auVar84._4_4_;
  auVar188._8_4_ = auVar70._8_4_ * auVar84._8_4_;
  auVar188._12_4_ = auVar70._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar81,auVar72);
  auVar68._0_4_ = auVar70._0_4_ * auVar84._0_4_;
  auVar68._4_4_ = auVar70._4_4_ * auVar84._4_4_;
  auVar68._8_4_ = auVar70._8_4_ * auVar84._8_4_;
  auVar68._12_4_ = auVar70._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar181,auVar154);
  auVar81 = vpminsd_avx(auVar187,auVar71);
  auVar84 = vmaxps_avx(auVar84,auVar81);
  auVar81 = vpminsd_avx(auVar188,auVar68);
  uVar137 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar80._4_4_ = uVar137;
  auVar80._0_4_ = uVar137;
  auVar80._8_4_ = uVar137;
  auVar80._12_4_ = uVar137;
  auVar81 = vmaxps_avx512vl(auVar81,auVar80);
  auVar84 = vmaxps_avx(auVar84,auVar81);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  local_460 = vmulps_avx512vl(auVar84,auVar87);
  auVar214 = ZEXT1664(local_460);
  auVar84 = vpmaxsd_avx(auVar181,auVar154);
  auVar81 = vpmaxsd_avx(auVar187,auVar71);
  auVar84 = vminps_avx(auVar84,auVar81);
  auVar81 = vpmaxsd_avx(auVar188,auVar68);
  fVar153 = (ray->super_RayK<1>).tfar;
  auVar212._4_4_ = fVar153;
  auVar212._0_4_ = fVar153;
  auVar212._8_4_ = fVar153;
  auVar212._12_4_ = fVar153;
  auVar81 = vminps_avx512vl(auVar81,auVar212);
  auVar84 = vminps_avx(auVar84,auVar81);
  auVar17._8_4_ = 0x3f800003;
  auVar17._0_8_ = 0x3f8000033f800003;
  auVar17._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar17);
  uVar145 = vcmpps_avx512vl(local_460,auVar84,2);
  uVar19 = vpcmpgtd_avx512vl(auVar67,_DAT_01f4ad30);
  uVar57 = (ulong)((byte)uVar145 & 0xf & (byte)uVar19);
  local_520 = prim;
  do {
    if (uVar57 == 0) {
      return;
    }
    local_448 = uVar57;
    lVar59 = 0;
    for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
      lVar59 = lVar59 + 1;
    }
    uVar55 = *(uint *)(prim + 2);
    uVar56 = *(uint *)(prim + lVar59 * 4 + 6);
    local_530 = (ulong)uVar55;
    pGVar62 = (context->scene->geometries).items[uVar55].ptr;
    local_528 = (ulong)uVar56;
    uVar57 = (ulong)*(uint *)(*(long *)&pGVar62->field_0x58 +
                             (ulong)uVar56 *
                             pGVar62[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar153 = (pGVar62->time_range).lower;
    fVar153 = pGVar62->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar153) /
              ((pGVar62->time_range).upper - fVar153));
    auVar84 = vroundss_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),9);
    auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar62->fnumTimeSegments + -1.0)));
    auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
    fVar153 = fVar153 - auVar84._0_4_;
    _Var9 = pGVar62[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar60 = (long)(int)auVar84._0_4_ * 0x38;
    lVar59 = *(long *)(_Var9 + 0x10 + lVar60);
    lVar58 = *(long *)(_Var9 + 0x38 + lVar60);
    lVar61 = *(long *)(_Var9 + 0x48 + lVar60);
    auVar147._4_4_ = fVar153;
    auVar147._0_4_ = fVar153;
    auVar147._8_4_ = fVar153;
    auVar147._12_4_ = fVar153;
    pfVar3 = (float *)(lVar58 + uVar57 * lVar61);
    auVar205._0_4_ = fVar153 * *pfVar3;
    auVar205._4_4_ = fVar153 * pfVar3[1];
    auVar205._8_4_ = fVar153 * pfVar3[2];
    auVar205._12_4_ = fVar153 * pfVar3[3];
    pfVar3 = (float *)(lVar58 + (uVar57 + 1) * lVar61);
    auVar207._0_4_ = fVar153 * *pfVar3;
    auVar207._4_4_ = fVar153 * pfVar3[1];
    auVar207._8_4_ = fVar153 * pfVar3[2];
    auVar207._12_4_ = fVar153 * pfVar3[3];
    auVar84 = vmulps_avx512vl(auVar147,*(undefined1 (*) [16])(lVar58 + (uVar57 + 2) * lVar61));
    auVar81 = vmulps_avx512vl(auVar147,*(undefined1 (*) [16])(lVar58 + lVar61 * (uVar57 + 3)));
    lVar58 = *(long *)(_Var9 + lVar60);
    fVar153 = 1.0 - fVar153;
    auVar67._4_4_ = fVar153;
    auVar67._0_4_ = fVar153;
    auVar67._8_4_ = fVar153;
    auVar67._12_4_ = fVar153;
    local_4b0 = vfmadd231ps_fma(auVar205,auVar67,*(undefined1 (*) [16])(lVar58 + lVar59 * uVar57));
    local_4c0 = vfmadd231ps_fma(auVar207,auVar67,
                                *(undefined1 (*) [16])(lVar58 + lVar59 * (uVar57 + 1)));
    local_4d0 = vfmadd231ps_avx512vl
                          (auVar84,auVar67,*(undefined1 (*) [16])(lVar58 + lVar59 * (uVar57 + 2)));
    _local_4e0 = vfmadd231ps_avx512vl
                           (auVar81,auVar67,*(undefined1 (*) [16])(lVar58 + lVar59 * (uVar57 + 3)));
    iVar8 = (int)pGVar62[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar4 = (ray->super_RayK<1>).org.field_0;
    auVar81 = vsubps_avx(local_4b0,(undefined1  [16])aVar4);
    uVar137 = auVar81._0_4_;
    auVar148._4_4_ = uVar137;
    auVar148._0_4_ = uVar137;
    auVar148._8_4_ = uVar137;
    auVar148._12_4_ = uVar137;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    aVar5 = (local_518->ray_space).vx.field_0;
    aVar6 = (local_518->ray_space).vy.field_0;
    fVar153 = (local_518->ray_space).vz.field_0.m128[0];
    fVar192 = (local_518->ray_space).vz.field_0.m128[1];
    fVar193 = (local_518->ray_space).vz.field_0.m128[2];
    fVar194 = (local_518->ray_space).vz.field_0.m128[3];
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar191._0_4_ = auVar81._0_4_ * fVar153;
    auVar191._4_4_ = auVar81._4_4_ * fVar192;
    auVar191._8_4_ = auVar81._8_4_ * fVar193;
    auVar191._12_4_ = auVar81._12_4_ * fVar194;
    auVar84 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar84);
    auVar7 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar148);
    auVar81 = vsubps_avx(local_4c0,(undefined1  [16])aVar4);
    uVar137 = auVar81._0_4_;
    auVar149._4_4_ = uVar137;
    auVar149._0_4_ = uVar137;
    auVar149._8_4_ = uVar137;
    auVar149._12_4_ = uVar137;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar197._0_4_ = auVar81._0_4_ * fVar153;
    auVar197._4_4_ = auVar81._4_4_ * fVar192;
    auVar197._8_4_ = auVar81._8_4_ * fVar193;
    auVar197._12_4_ = auVar81._12_4_ * fVar194;
    auVar84 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar6,auVar84);
    auVar83 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar149);
    auVar81 = vsubps_avx512vl(local_4d0,(undefined1  [16])aVar4);
    uVar137 = auVar81._0_4_;
    auVar150._4_4_ = uVar137;
    auVar150._0_4_ = uVar137;
    auVar150._8_4_ = uVar137;
    auVar150._12_4_ = uVar137;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar200._0_4_ = auVar81._0_4_ * fVar153;
    auVar200._4_4_ = auVar81._4_4_ * fVar192;
    auVar200._8_4_ = auVar81._8_4_ * fVar193;
    auVar200._12_4_ = auVar81._12_4_ * fVar194;
    auVar84 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar84);
    auVar82 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar150);
    local_3a0 = ZEXT1632((undefined1  [16])aVar4);
    auVar81 = vsubps_avx512vl(_local_4e0,(undefined1  [16])aVar4);
    uVar137 = auVar81._0_4_;
    auVar151._4_4_ = uVar137;
    auVar151._0_4_ = uVar137;
    auVar151._8_4_ = uVar137;
    auVar151._12_4_ = uVar137;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar201._0_4_ = auVar81._0_4_ * fVar153;
    auVar201._4_4_ = auVar81._4_4_ * fVar192;
    auVar201._8_4_ = auVar81._8_4_ * fVar193;
    auVar201._12_4_ = auVar81._12_4_ * fVar194;
    auVar84 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar84);
    auVar75 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar151);
    local_538 = (long)iVar8;
    lVar59 = local_538 * 0x44;
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar59);
    uVar137 = auVar7._0_4_;
    local_2a0._4_4_ = uVar137;
    local_2a0._0_4_ = uVar137;
    local_2a0._8_4_ = uVar137;
    local_2a0._12_4_ = uVar137;
    local_2a0._16_4_ = uVar137;
    local_2a0._20_4_ = uVar137;
    local_2a0._24_4_ = uVar137;
    local_2a0._28_4_ = uVar137;
    auVar88._8_4_ = 1;
    auVar88._0_8_ = 0x100000001;
    auVar88._12_4_ = 1;
    auVar88._16_4_ = 1;
    auVar88._20_4_ = 1;
    auVar88._24_4_ = 1;
    auVar88._28_4_ = 1;
    local_2c0 = vpermps_avx2(auVar88,ZEXT1632(auVar7));
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 + 0x484);
    uVar137 = auVar83._0_4_;
    auVar167._4_4_ = uVar137;
    auVar167._0_4_ = uVar137;
    auVar167._8_4_ = uVar137;
    auVar167._12_4_ = uVar137;
    local_2e0._16_4_ = uVar137;
    local_2e0._0_16_ = auVar167;
    local_2e0._20_4_ = uVar137;
    local_2e0._24_4_ = uVar137;
    local_2e0._28_4_ = uVar137;
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 + 0x908);
    local_300 = vpermps_avx512vl(auVar88,ZEXT1632(auVar83));
    local_320 = vbroadcastss_avx512vl(auVar82);
    local_340 = vpermps_avx512vl(auVar88,ZEXT1632(auVar82));
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 + 0xd8c);
    fVar153 = auVar75._0_4_;
    local_360._4_4_ = fVar153;
    local_360._0_4_ = fVar153;
    fStack_358 = fVar153;
    fStack_354 = fVar153;
    fStack_350 = fVar153;
    fStack_34c = fVar153;
    fStack_348 = fVar153;
    register0x0000139c = fVar153;
    _local_380 = vpermps_avx512vl(auVar88,ZEXT1632(auVar75));
    auVar88 = vmulps_avx512vl(_local_360,auVar100);
    auVar89 = vmulps_avx512vl(_local_380,auVar100);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_320);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar101,local_340);
    auVar84 = vfmadd231ps_fma(auVar88,auVar103,local_2e0);
    auVar90 = vfmadd231ps_avx512vl(auVar89,auVar103,local_300);
    auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar102,local_2a0);
    auVar186 = ZEXT3264(auVar91);
    auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar59);
    auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 + 0x484);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar102,local_2c0);
    auVar179 = ZEXT3264(auVar92);
    auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 + 0x908);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 + 0xd8c);
    auVar93 = vmulps_avx512vl(_local_360,auVar99);
    auVar94 = vmulps_avx512vl(_local_380,auVar99);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_320);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_340);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_2e0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,local_300);
    auVar76 = vfmadd231ps_fma(auVar93,auVar88,local_2a0);
    auVar189 = ZEXT1664(auVar76);
    auVar74 = vfmadd231ps_fma(auVar94,auVar88,local_2c0);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar76),auVar91);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar74),auVar92);
    auVar93 = vmulps_avx512vl(auVar92,auVar94);
    auVar96 = vmulps_avx512vl(auVar91,auVar95);
    auVar93 = vsubps_avx512vl(auVar93,auVar96);
    auVar84 = vshufps_avx(local_4b0,local_4b0,0xff);
    uVar145 = auVar84._0_8_;
    local_80._8_8_ = uVar145;
    local_80._0_8_ = uVar145;
    local_80._16_8_ = uVar145;
    local_80._24_8_ = uVar145;
    auVar84 = vshufps_avx(local_4c0,local_4c0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar84);
    auVar84 = vshufps_avx512vl(local_4d0,local_4d0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar84);
    auVar84 = vshufps_avx512vl(_local_4e0,_local_4e0,0xff);
    uVar145 = auVar84._0_8_;
    local_e0._8_8_ = uVar145;
    local_e0._0_8_ = uVar145;
    local_e0._16_8_ = uVar145;
    local_e0._24_8_ = uVar145;
    auVar96 = vmulps_avx512vl(local_e0,auVar100);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_c0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,local_a0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_80);
    auVar97 = vmulps_avx512vl(local_e0,auVar99);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,local_a0);
    auVar73 = vfmadd231ps_fma(auVar97,auVar88,local_80);
    auVar97 = vmulps_avx512vl(auVar95,auVar95);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar94);
    auVar98 = vmaxps_avx512vl(auVar96,ZEXT1632(auVar73));
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    uVar145 = vcmpps_avx512vl(auVar93,auVar97,2);
    auVar80 = local_4b0;
    auVar84 = vblendps_avx(auVar7,local_4b0,8);
    auVar212 = auVar213._0_16_;
    auVar81 = vandps_avx512vl(auVar84,auVar212);
    auVar79 = local_4c0;
    auVar84 = vblendps_avx(auVar83,local_4c0,8);
    auVar84 = vandps_avx512vl(auVar84,auVar212);
    auVar81 = vmaxps_avx(auVar81,auVar84);
    auVar78 = local_4d0;
    auVar84 = vblendps_avx(auVar82,local_4d0,8);
    auVar87 = vandps_avx512vl(auVar84,auVar212);
    auVar77 = _local_4e0;
    auVar84 = vblendps_avx(auVar75,_local_4e0,8);
    auVar84 = vandps_avx512vl(auVar84,auVar212);
    auVar84 = vmaxps_avx(auVar87,auVar84);
    auVar84 = vmaxps_avx(auVar81,auVar84);
    auVar81 = vmovshdup_avx(auVar84);
    auVar81 = vmaxss_avx(auVar81,auVar84);
    auVar84 = vshufpd_avx(auVar84,auVar84,1);
    auVar84 = vmaxss_avx(auVar84,auVar81);
    auVar81 = vcvtsi2ss_avx512f(auVar212,iVar8);
    local_420._0_16_ = auVar81;
    auVar206._0_4_ = auVar81._0_4_;
    auVar206._4_4_ = auVar206._0_4_;
    auVar206._8_4_ = auVar206._0_4_;
    auVar206._12_4_ = auVar206._0_4_;
    auVar206._16_4_ = auVar206._0_4_;
    auVar206._20_4_ = auVar206._0_4_;
    auVar206._24_4_ = auVar206._0_4_;
    auVar206._28_4_ = auVar206._0_4_;
    uVar19 = vcmpps_avx512vl(auVar206,_DAT_01f7b060,0xe);
    bVar63 = (byte)uVar145 & (byte)uVar19;
    auVar84 = vmulss_avx512f(auVar84,SUB6416(ZEXT464(0x35000000),0));
    local_400._0_16_ = auVar84;
    auVar93 = local_400;
    auVar98._8_4_ = 2;
    auVar98._0_8_ = 0x200000002;
    auVar98._12_4_ = 2;
    auVar98._16_4_ = 2;
    auVar98._20_4_ = 2;
    auVar98._24_4_ = 2;
    auVar98._28_4_ = 2;
    auVar97 = vpermps_avx512vl(auVar98,ZEXT1632(auVar7));
    local_120 = vpermps_avx2(auVar98,ZEXT1632(auVar83));
    local_140 = vpermps_avx2(auVar98,ZEXT1632(auVar82));
    local_160 = vpermps_avx2(auVar98,ZEXT1632(auVar75));
    _local_4e0 = auVar77;
    local_4d0 = auVar78;
    local_4c0 = auVar79;
    local_4b0 = auVar80;
    local_400 = auVar93;
    if (bVar63 != 0) {
      auVar99 = vmulps_avx512vl(local_160,auVar99);
      auVar90 = vfmadd213ps_avx512vl(auVar90,local_140,auVar99);
      auVar89 = vfmadd213ps_avx512vl(auVar89,local_120,auVar90);
      auVar93 = vfmadd213ps_avx512vl(auVar88,auVar97,auVar89);
      auVar100 = vmulps_avx512vl(local_160,auVar100);
      auVar101 = vfmadd213ps_avx512vl(auVar101,local_140,auVar100);
      auVar89 = vfmadd213ps_avx512vl(auVar103,local_120,auVar101);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 + 0x1210);
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 + 0x1694);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 + 0x1b18);
      auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 + 0x1f9c);
      auVar98 = vfmadd213ps_avx512vl(auVar102,auVar97,auVar89);
      auVar198._0_4_ = fVar153 * auVar88._0_4_;
      auVar198._4_4_ = fVar153 * auVar88._4_4_;
      auVar198._8_4_ = fVar153 * auVar88._8_4_;
      auVar198._12_4_ = fVar153 * auVar88._12_4_;
      auVar198._16_4_ = fVar153 * auVar88._16_4_;
      auVar198._20_4_ = fVar153 * auVar88._20_4_;
      auVar198._24_4_ = fVar153 * auVar88._24_4_;
      auVar198._28_4_ = 0;
      auVar102 = vmulps_avx512vl(_local_380,auVar88);
      auVar88 = vmulps_avx512vl(local_160,auVar88);
      auVar89 = vfmadd231ps_avx512vl(auVar198,auVar100,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_340);
      auVar100 = vfmadd231ps_avx512vl(auVar88,local_140,auVar100);
      auVar88 = vfmadd231ps_avx512vl(auVar89,auVar101,local_2e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_300);
      auVar89 = vfmadd231ps_avx512vl(auVar100,local_120,auVar101);
      auVar81 = vfmadd231ps_fma(auVar88,auVar103,local_2a0);
      auVar88 = vfmadd231ps_avx512vl(auVar102,auVar103,local_2c0);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 + 0x1210);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 + 0x1b18);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 + 0x1f9c);
      auVar90 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar103);
      auVar89._4_4_ = fVar153 * auVar100._4_4_;
      auVar89._0_4_ = fVar153 * auVar100._0_4_;
      auVar89._8_4_ = fVar153 * auVar100._8_4_;
      auVar89._12_4_ = fVar153 * auVar100._12_4_;
      auVar89._16_4_ = fVar153 * auVar100._16_4_;
      auVar89._20_4_ = fVar153 * auVar100._20_4_;
      auVar89._24_4_ = fVar153 * auVar100._24_4_;
      auVar89._28_4_ = auVar103._28_4_;
      auVar103 = vmulps_avx512vl(_local_380,auVar100);
      auVar100 = vmulps_avx512vl(local_160,auVar100);
      auVar213 = ZEXT1664(auVar212);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar101,local_320);
      auVar99 = vfmadd231ps_avx512vl(auVar103,auVar101,local_340);
      auVar211 = ZEXT3264(auVar97);
      auVar101 = vfmadd231ps_avx512vl(auVar100,local_140,auVar101);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 + 0x1694);
      auVar100 = vfmadd231ps_avx512vl(auVar89,auVar103,local_2e0);
      auVar89 = vfmadd231ps_avx512vl(auVar99,auVar103,local_300);
      auVar103 = vfmadd231ps_avx512vl(auVar101,local_120,auVar103);
      auVar7 = vfmadd231ps_fma(auVar100,auVar102,local_2a0);
      auVar101 = vfmadd231ps_avx512vl(auVar89,auVar102,local_2c0);
      auVar100 = vfmadd231ps_avx512vl(auVar103,auVar97,auVar102);
      auVar209._8_4_ = 0x7fffffff;
      auVar209._0_8_ = 0x7fffffff7fffffff;
      auVar209._12_4_ = 0x7fffffff;
      auVar209._16_4_ = 0x7fffffff;
      auVar209._20_4_ = 0x7fffffff;
      auVar209._24_4_ = 0x7fffffff;
      auVar209._28_4_ = 0x7fffffff;
      auVar102 = vandps_avx(ZEXT1632(auVar81),auVar209);
      auVar103 = vandps_avx(auVar88,auVar209);
      auVar103 = vmaxps_avx(auVar102,auVar103);
      auVar102 = vandps_avx(auVar90,auVar209);
      auVar102 = vmaxps_avx(auVar103,auVar102);
      local_400._0_4_ = auVar84._0_4_;
      auVar202._4_4_ = local_400._0_4_;
      auVar202._0_4_ = local_400._0_4_;
      auVar202._8_4_ = local_400._0_4_;
      auVar202._12_4_ = local_400._0_4_;
      auVar202._16_4_ = local_400._0_4_;
      auVar202._20_4_ = local_400._0_4_;
      auVar202._24_4_ = local_400._0_4_;
      auVar202._28_4_ = local_400._0_4_;
      uVar57 = vcmpps_avx512vl(auVar102,auVar202,1);
      bVar11 = (bool)((byte)uVar57 & 1);
      auVar104._0_4_ = (float)((uint)bVar11 * auVar94._0_4_ | (uint)!bVar11 * auVar81._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar11 * auVar94._4_4_ | (uint)!bVar11 * auVar81._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar11 * auVar94._8_4_ | (uint)!bVar11 * auVar81._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar11 * auVar94._12_4_ | (uint)!bVar11 * auVar81._12_4_);
      fVar192 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar94._16_4_);
      auVar104._16_4_ = fVar192;
      fVar153 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar94._20_4_);
      auVar104._20_4_ = fVar153;
      fVar193 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar94._24_4_);
      auVar104._24_4_ = fVar193;
      uVar54 = (uint)(byte)(uVar57 >> 7) * auVar94._28_4_;
      auVar104._28_4_ = uVar54;
      bVar11 = (bool)((byte)uVar57 & 1);
      auVar105._0_4_ = (float)((uint)bVar11 * auVar95._0_4_ | (uint)!bVar11 * auVar88._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar88._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar88._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar88._12_4_);
      bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * auVar88._16_4_);
      bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * auVar88._20_4_);
      bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * auVar88._24_4_);
      bVar11 = SUB81(uVar57 >> 7,0);
      auVar105._28_4_ = (uint)bVar11 * auVar95._28_4_ | (uint)!bVar11 * auVar88._28_4_;
      auVar102 = vandps_avx(auVar209,ZEXT1632(auVar7));
      auVar103 = vandps_avx(auVar101,auVar209);
      auVar103 = vmaxps_avx(auVar102,auVar103);
      auVar102 = vandps_avx(auVar100,auVar209);
      auVar102 = vmaxps_avx(auVar103,auVar102);
      uVar57 = vcmpps_avx512vl(auVar102,auVar202,1);
      bVar11 = (bool)((byte)uVar57 & 1);
      auVar106._0_4_ = (float)((uint)bVar11 * auVar94._0_4_ | (uint)!bVar11 * auVar7._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar11 * auVar94._4_4_ | (uint)!bVar11 * auVar7._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar11 * auVar94._8_4_ | (uint)!bVar11 * auVar7._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar11 * auVar94._12_4_ | (uint)!bVar11 * auVar7._12_4_);
      fVar194 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar94._16_4_);
      auVar106._16_4_ = fVar194;
      fVar195 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar94._20_4_);
      auVar106._20_4_ = fVar195;
      fVar165 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar94._24_4_);
      auVar106._24_4_ = fVar165;
      auVar106._28_4_ = (uint)(byte)(uVar57 >> 7) * auVar94._28_4_;
      bVar11 = (bool)((byte)uVar57 & 1);
      auVar107._0_4_ = (float)((uint)bVar11 * auVar95._0_4_ | (uint)!bVar11 * auVar101._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar101._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar101._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar101._12_4_);
      bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
      auVar107._16_4_ = (float)((uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * auVar101._16_4_);
      bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
      auVar107._20_4_ = (float)((uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * auVar101._20_4_);
      bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
      auVar107._24_4_ = (float)((uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * auVar101._24_4_);
      bVar11 = SUB81(uVar57 >> 7,0);
      auVar107._28_4_ = (uint)bVar11 * auVar95._28_4_ | (uint)!bVar11 * auVar101._28_4_;
      auVar70 = vxorps_avx512vl(auVar167,auVar167);
      auVar102 = vfmadd213ps_avx512vl(auVar104,auVar104,ZEXT1632(auVar70));
      auVar84 = vfmadd231ps_fma(auVar102,auVar105,auVar105);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar65 = auVar101._0_4_;
      fVar66 = auVar101._4_4_;
      fVar128 = auVar101._8_4_;
      fVar129 = auVar101._12_4_;
      fVar130 = auVar101._16_4_;
      fVar131 = auVar101._20_4_;
      fVar133 = auVar101._24_4_;
      auVar102._4_4_ = fVar66 * fVar66 * fVar66 * auVar84._4_4_ * -0.5;
      auVar102._0_4_ = fVar65 * fVar65 * fVar65 * auVar84._0_4_ * -0.5;
      auVar102._8_4_ = fVar128 * fVar128 * fVar128 * auVar84._8_4_ * -0.5;
      auVar102._12_4_ = fVar129 * fVar129 * fVar129 * auVar84._12_4_ * -0.5;
      auVar102._16_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar102._20_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar102._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar102._28_4_ = 0;
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar88,auVar101);
      auVar103._4_4_ = auVar105._4_4_ * auVar102._4_4_;
      auVar103._0_4_ = auVar105._0_4_ * auVar102._0_4_;
      auVar103._8_4_ = auVar105._8_4_ * auVar102._8_4_;
      auVar103._12_4_ = auVar105._12_4_ * auVar102._12_4_;
      auVar103._16_4_ = auVar105._16_4_ * auVar102._16_4_;
      auVar103._20_4_ = auVar105._20_4_ * auVar102._20_4_;
      auVar103._24_4_ = auVar105._24_4_ * auVar102._24_4_;
      auVar103._28_4_ = auVar101._28_4_;
      auVar101._4_4_ = auVar102._4_4_ * -auVar104._4_4_;
      auVar101._0_4_ = auVar102._0_4_ * -auVar104._0_4_;
      auVar101._8_4_ = auVar102._8_4_ * -auVar104._8_4_;
      auVar101._12_4_ = auVar102._12_4_ * -auVar104._12_4_;
      auVar101._16_4_ = auVar102._16_4_ * -fVar192;
      auVar101._20_4_ = auVar102._20_4_ * -fVar153;
      auVar101._24_4_ = auVar102._24_4_ * -fVar193;
      auVar101._28_4_ = uVar54 ^ 0x80000000;
      auVar89 = vmulps_avx512vl(auVar102,ZEXT1632(auVar70));
      auVar94 = ZEXT1632(auVar70);
      auVar100 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar94);
      auVar84 = vfmadd231ps_fma(auVar100,auVar107,auVar107);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar153 = auVar99._0_4_;
      fVar192 = auVar99._4_4_;
      fVar193 = auVar99._8_4_;
      fVar65 = auVar99._12_4_;
      fVar66 = auVar99._16_4_;
      fVar128 = auVar99._20_4_;
      fVar129 = auVar99._24_4_;
      auVar100._4_4_ = fVar192 * fVar192 * fVar192 * auVar84._4_4_ * -0.5;
      auVar100._0_4_ = fVar153 * fVar153 * fVar153 * auVar84._0_4_ * -0.5;
      auVar100._8_4_ = fVar193 * fVar193 * fVar193 * auVar84._8_4_ * -0.5;
      auVar100._12_4_ = fVar65 * fVar65 * fVar65 * auVar84._12_4_ * -0.5;
      auVar100._16_4_ = fVar66 * fVar66 * fVar66 * -0.0;
      auVar100._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar100._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar100._28_4_ = 0;
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar99);
      auVar90._4_4_ = auVar107._4_4_ * auVar100._4_4_;
      auVar90._0_4_ = auVar107._0_4_ * auVar100._0_4_;
      auVar90._8_4_ = auVar107._8_4_ * auVar100._8_4_;
      auVar90._12_4_ = auVar107._12_4_ * auVar100._12_4_;
      auVar90._16_4_ = auVar107._16_4_ * auVar100._16_4_;
      auVar90._20_4_ = auVar107._20_4_ * auVar100._20_4_;
      auVar90._24_4_ = auVar107._24_4_ * auVar100._24_4_;
      auVar90._28_4_ = auVar99._28_4_;
      auVar99._4_4_ = -auVar106._4_4_ * auVar100._4_4_;
      auVar99._0_4_ = -auVar106._0_4_ * auVar100._0_4_;
      auVar99._8_4_ = -auVar106._8_4_ * auVar100._8_4_;
      auVar99._12_4_ = -auVar106._12_4_ * auVar100._12_4_;
      auVar99._16_4_ = -fVar194 * auVar100._16_4_;
      auVar99._20_4_ = -fVar195 * auVar100._20_4_;
      auVar99._24_4_ = -fVar165 * auVar100._24_4_;
      auVar99._28_4_ = auVar102._28_4_;
      auVar102 = vmulps_avx512vl(auVar100,auVar94);
      auVar84 = vfmadd213ps_fma(auVar103,auVar96,auVar91);
      auVar81 = vfmadd213ps_fma(auVar101,auVar96,auVar92);
      auVar100 = vfmadd213ps_avx512vl(auVar89,auVar96,auVar98);
      auVar88 = vfmadd213ps_avx512vl(auVar90,ZEXT1632(auVar73),ZEXT1632(auVar76));
      auVar87 = vfnmadd213ps_fma(auVar103,auVar96,auVar91);
      auVar91 = ZEXT1632(auVar73);
      auVar7 = vfmadd213ps_fma(auVar99,auVar91,ZEXT1632(auVar74));
      auVar212 = vfnmadd213ps_fma(auVar101,auVar96,auVar92);
      auVar83 = vfmadd213ps_fma(auVar102,auVar91,auVar93);
      auVar103 = vfnmadd231ps_avx512vl(auVar98,auVar96,auVar89);
      auVar76 = vfnmadd213ps_fma(auVar90,auVar91,ZEXT1632(auVar76));
      auVar74 = vfnmadd213ps_fma(auVar99,auVar91,ZEXT1632(auVar74));
      auVar17 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar73),auVar102);
      auVar101 = vsubps_avx512vl(auVar88,ZEXT1632(auVar87));
      auVar102 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar212));
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar83),auVar103);
      auVar90 = vmulps_avx512vl(auVar102,auVar103);
      auVar82 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar212),auVar89);
      auVar93._4_4_ = auVar87._4_4_ * auVar89._4_4_;
      auVar93._0_4_ = auVar87._0_4_ * auVar89._0_4_;
      auVar93._8_4_ = auVar87._8_4_ * auVar89._8_4_;
      auVar93._12_4_ = auVar87._12_4_ * auVar89._12_4_;
      auVar93._16_4_ = auVar89._16_4_ * 0.0;
      auVar93._20_4_ = auVar89._20_4_ * 0.0;
      auVar93._24_4_ = auVar89._24_4_ * 0.0;
      auVar93._28_4_ = auVar89._28_4_;
      auVar89 = vfmsub231ps_avx512vl(auVar93,auVar103,auVar101);
      auVar91._4_4_ = auVar212._4_4_ * auVar101._4_4_;
      auVar91._0_4_ = auVar212._0_4_ * auVar101._0_4_;
      auVar91._8_4_ = auVar212._8_4_ * auVar101._8_4_;
      auVar91._12_4_ = auVar212._12_4_ * auVar101._12_4_;
      auVar91._16_4_ = auVar101._16_4_ * 0.0;
      auVar91._20_4_ = auVar101._20_4_ * 0.0;
      auVar91._24_4_ = auVar101._24_4_ * 0.0;
      auVar91._28_4_ = auVar101._28_4_;
      auVar75 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar87),auVar102);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar94,auVar89);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,ZEXT1632(auVar82));
      auVar98 = ZEXT1632(auVar70);
      uVar57 = vcmpps_avx512vl(auVar102,auVar98,2);
      bVar53 = (byte)uVar57;
      fVar65 = (float)((uint)(bVar53 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar76._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      fVar128 = (float)((uint)bVar11 * auVar84._4_4_ | (uint)!bVar11 * auVar76._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      fVar130 = (float)((uint)bVar11 * auVar84._8_4_ | (uint)!bVar11 * auVar76._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      fVar133 = (float)((uint)bVar11 * auVar84._12_4_ | (uint)!bVar11 * auVar76._12_4_);
      auVar90 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar130,CONCAT44(fVar128,fVar65))));
      fVar66 = (float)((uint)(bVar53 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar74._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      fVar129 = (float)((uint)bVar11 * auVar81._4_4_ | (uint)!bVar11 * auVar74._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      fVar131 = (float)((uint)bVar11 * auVar81._8_4_ | (uint)!bVar11 * auVar74._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      fVar134 = (float)((uint)bVar11 * auVar81._12_4_ | (uint)!bVar11 * auVar74._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar129,fVar66))));
      auVar108._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar17._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar17._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar17._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar17._12_4_);
      fVar153 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar100._16_4_);
      auVar108._16_4_ = fVar153;
      fVar192 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar100._20_4_);
      auVar108._20_4_ = fVar192;
      fVar193 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar100._24_4_);
      auVar108._24_4_ = fVar193;
      iVar1 = (uint)(byte)(uVar57 >> 7) * auVar100._28_4_;
      auVar108._28_4_ = iVar1;
      auVar101 = vblendmps_avx512vl(ZEXT1632(auVar87),auVar88);
      auVar109._0_4_ =
           (uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar82._0_4_;
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar82._4_4_;
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar82._8_4_;
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar82._12_4_;
      auVar109._16_4_ = (uint)((byte)(uVar57 >> 4) & 1) * auVar101._16_4_;
      auVar109._20_4_ = (uint)((byte)(uVar57 >> 5) & 1) * auVar101._20_4_;
      auVar109._24_4_ = (uint)((byte)(uVar57 >> 6) & 1) * auVar101._24_4_;
      auVar109._28_4_ = (uint)(byte)(uVar57 >> 7) * auVar101._28_4_;
      auVar101 = vblendmps_avx512vl(ZEXT1632(auVar212),ZEXT1632(auVar7));
      auVar110._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar81._0_4_);
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar81._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar81._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar81._12_4_);
      fVar195 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar101._16_4_);
      auVar110._16_4_ = fVar195;
      fVar165 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar101._20_4_);
      auVar110._20_4_ = fVar165;
      fVar194 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar101._24_4_);
      auVar110._24_4_ = fVar194;
      auVar110._28_4_ = (uint)(byte)(uVar57 >> 7) * auVar101._28_4_;
      auVar101 = vblendmps_avx512vl(auVar103,ZEXT1632(auVar83));
      auVar111._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar100._0_4_)
      ;
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar100._4_4_);
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar100._8_4_);
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar100._12_4_);
      bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar11 * auVar101._16_4_ | (uint)!bVar11 * auVar100._16_4_);
      bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar11 * auVar101._20_4_ | (uint)!bVar11 * auVar100._20_4_);
      bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar11 * auVar101._24_4_ | (uint)!bVar11 * auVar100._24_4_);
      bVar11 = SUB81(uVar57 >> 7,0);
      auVar111._28_4_ = (uint)bVar11 * auVar101._28_4_ | (uint)!bVar11 * auVar100._28_4_;
      auVar112._0_4_ =
           (uint)(bVar53 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar88._0_4_;
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar11 * (int)auVar87._4_4_ | (uint)!bVar11 * auVar88._4_4_;
      bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar11 * (int)auVar87._8_4_ | (uint)!bVar11 * auVar88._8_4_;
      bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar11 * (int)auVar87._12_4_ | (uint)!bVar11 * auVar88._12_4_;
      auVar112._16_4_ = (uint)!(bool)((byte)(uVar57 >> 4) & 1) * auVar88._16_4_;
      auVar112._20_4_ = (uint)!(bool)((byte)(uVar57 >> 5) & 1) * auVar88._20_4_;
      auVar112._24_4_ = (uint)!(bool)((byte)(uVar57 >> 6) & 1) * auVar88._24_4_;
      auVar112._28_4_ = (uint)!SUB81(uVar57 >> 7,0) * auVar88._28_4_;
      bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar57 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar113._0_4_ =
           (uint)(bVar53 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar83._0_4_;
      bVar12 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar83._4_4_;
      bVar12 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar83._8_4_;
      bVar12 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar83._12_4_;
      auVar113._16_4_ = (uint)((byte)(uVar57 >> 4) & 1) * auVar103._16_4_;
      auVar113._20_4_ = (uint)((byte)(uVar57 >> 5) & 1) * auVar103._20_4_;
      auVar113._24_4_ = (uint)((byte)(uVar57 >> 6) & 1) * auVar103._24_4_;
      iVar2 = (uint)(byte)(uVar57 >> 7) * auVar103._28_4_;
      auVar113._28_4_ = iVar2;
      auVar93 = vsubps_avx512vl(auVar112,auVar90);
      auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar212._12_4_ |
                                               (uint)!bVar14 * auVar7._12_4_,
                                               CONCAT48((uint)bVar13 * (int)auVar212._8_4_ |
                                                        (uint)!bVar13 * auVar7._8_4_,
                                                        CONCAT44((uint)bVar11 * (int)auVar212._4_4_
                                                                 | (uint)!bVar11 * auVar7._4_4_,
                                                                 (uint)(bVar53 & 1) *
                                                                 (int)auVar212._0_4_ |
                                                                 (uint)!(bool)(bVar53 & 1) *
                                                                 auVar7._0_4_)))),auVar99);
      auVar186 = ZEXT3264(auVar103);
      auVar101 = vsubps_avx(auVar113,auVar108);
      auVar100 = vsubps_avx(auVar90,auVar109);
      auVar189 = ZEXT3264(auVar100);
      auVar88 = vsubps_avx(auVar99,auVar110);
      auVar89 = vsubps_avx(auVar108,auVar111);
      auVar92._4_4_ = auVar101._4_4_ * fVar128;
      auVar92._0_4_ = auVar101._0_4_ * fVar65;
      auVar92._8_4_ = auVar101._8_4_ * fVar130;
      auVar92._12_4_ = auVar101._12_4_ * fVar133;
      auVar92._16_4_ = auVar101._16_4_ * 0.0;
      auVar92._20_4_ = auVar101._20_4_ * 0.0;
      auVar92._24_4_ = auVar101._24_4_ * 0.0;
      auVar92._28_4_ = iVar2;
      auVar84 = vfmsub231ps_fma(auVar92,auVar108,auVar93);
      auVar94._4_4_ = fVar129 * auVar93._4_4_;
      auVar94._0_4_ = fVar66 * auVar93._0_4_;
      auVar94._8_4_ = fVar131 * auVar93._8_4_;
      auVar94._12_4_ = fVar134 * auVar93._12_4_;
      auVar94._16_4_ = auVar93._16_4_ * 0.0;
      auVar94._20_4_ = auVar93._20_4_ * 0.0;
      auVar94._24_4_ = auVar93._24_4_ * 0.0;
      auVar94._28_4_ = auVar102._28_4_;
      auVar81 = vfmsub231ps_fma(auVar94,auVar90,auVar103);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar98,ZEXT1632(auVar84));
      auVar175._0_4_ = auVar103._0_4_ * auVar108._0_4_;
      auVar175._4_4_ = auVar103._4_4_ * auVar108._4_4_;
      auVar175._8_4_ = auVar103._8_4_ * auVar108._8_4_;
      auVar175._12_4_ = auVar103._12_4_ * auVar108._12_4_;
      auVar175._16_4_ = auVar103._16_4_ * fVar153;
      auVar175._20_4_ = auVar103._20_4_ * fVar192;
      auVar175._24_4_ = auVar103._24_4_ * fVar193;
      auVar175._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar175,auVar99,auVar101);
      auVar91 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar84));
      auVar102 = vmulps_avx512vl(auVar89,auVar109);
      auVar102 = vfmsub231ps_avx512vl(auVar102,auVar100,auVar111);
      auVar95._4_4_ = auVar88._4_4_ * auVar111._4_4_;
      auVar95._0_4_ = auVar88._0_4_ * auVar111._0_4_;
      auVar95._8_4_ = auVar88._8_4_ * auVar111._8_4_;
      auVar95._12_4_ = auVar88._12_4_ * auVar111._12_4_;
      auVar95._16_4_ = auVar88._16_4_ * auVar111._16_4_;
      auVar95._20_4_ = auVar88._20_4_ * auVar111._20_4_;
      auVar95._24_4_ = auVar88._24_4_ * auVar111._24_4_;
      auVar95._28_4_ = auVar111._28_4_;
      auVar84 = vfmsub231ps_fma(auVar95,auVar110,auVar89);
      auVar176._0_4_ = auVar110._0_4_ * auVar100._0_4_;
      auVar176._4_4_ = auVar110._4_4_ * auVar100._4_4_;
      auVar176._8_4_ = auVar110._8_4_ * auVar100._8_4_;
      auVar176._12_4_ = auVar110._12_4_ * auVar100._12_4_;
      auVar176._16_4_ = fVar195 * auVar100._16_4_;
      auVar176._20_4_ = fVar165 * auVar100._20_4_;
      auVar176._24_4_ = fVar194 * auVar100._24_4_;
      auVar176._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar176,auVar88,auVar109);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar98,auVar102);
      auVar92 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar84));
      auVar179 = ZEXT3264(auVar92);
      auVar102 = vmaxps_avx(auVar91,auVar92);
      uVar145 = vcmpps_avx512vl(auVar102,auVar98,2);
      bVar63 = bVar63 & (byte)uVar145;
      if (bVar63 != 0) {
        auVar31._4_4_ = auVar89._4_4_ * auVar103._4_4_;
        auVar31._0_4_ = auVar89._0_4_ * auVar103._0_4_;
        auVar31._8_4_ = auVar89._8_4_ * auVar103._8_4_;
        auVar31._12_4_ = auVar89._12_4_ * auVar103._12_4_;
        auVar31._16_4_ = auVar89._16_4_ * auVar103._16_4_;
        auVar31._20_4_ = auVar89._20_4_ * auVar103._20_4_;
        auVar31._24_4_ = auVar89._24_4_ * auVar103._24_4_;
        auVar31._28_4_ = auVar102._28_4_;
        auVar83 = vfmsub231ps_fma(auVar31,auVar88,auVar101);
        auVar32._4_4_ = auVar101._4_4_ * auVar100._4_4_;
        auVar32._0_4_ = auVar101._0_4_ * auVar100._0_4_;
        auVar32._8_4_ = auVar101._8_4_ * auVar100._8_4_;
        auVar32._12_4_ = auVar101._12_4_ * auVar100._12_4_;
        auVar32._16_4_ = auVar101._16_4_ * auVar100._16_4_;
        auVar32._20_4_ = auVar101._20_4_ * auVar100._20_4_;
        auVar32._24_4_ = auVar101._24_4_ * auVar100._24_4_;
        auVar32._28_4_ = auVar101._28_4_;
        auVar7 = vfmsub231ps_fma(auVar32,auVar93,auVar89);
        auVar33._4_4_ = auVar88._4_4_ * auVar93._4_4_;
        auVar33._0_4_ = auVar88._0_4_ * auVar93._0_4_;
        auVar33._8_4_ = auVar88._8_4_ * auVar93._8_4_;
        auVar33._12_4_ = auVar88._12_4_ * auVar93._12_4_;
        auVar33._16_4_ = auVar88._16_4_ * auVar93._16_4_;
        auVar33._20_4_ = auVar88._20_4_ * auVar93._20_4_;
        auVar33._24_4_ = auVar88._24_4_ * auVar93._24_4_;
        auVar33._28_4_ = auVar88._28_4_;
        auVar82 = vfmsub231ps_fma(auVar33,auVar100,auVar103);
        auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar7),ZEXT1632(auVar82));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar83),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar102 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
        auVar22._8_4_ = 0x3f800000;
        auVar22._0_8_ = 0x3f8000003f800000;
        auVar22._12_4_ = 0x3f800000;
        auVar22._16_4_ = 0x3f800000;
        auVar22._20_4_ = 0x3f800000;
        auVar22._24_4_ = 0x3f800000;
        auVar22._28_4_ = 0x3f800000;
        auVar103 = vfnmadd213ps_avx512vl(auVar102,ZEXT1632(auVar81),auVar22);
        auVar84 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
        auVar186 = ZEXT1664(auVar84);
        auVar34._4_4_ = auVar82._4_4_ * auVar108._4_4_;
        auVar34._0_4_ = auVar82._0_4_ * auVar108._0_4_;
        auVar34._8_4_ = auVar82._8_4_ * auVar108._8_4_;
        auVar34._12_4_ = auVar82._12_4_ * auVar108._12_4_;
        auVar34._16_4_ = fVar153 * 0.0;
        auVar34._20_4_ = fVar192 * 0.0;
        auVar34._24_4_ = fVar193 * 0.0;
        auVar34._28_4_ = iVar1;
        auVar7 = vfmadd231ps_fma(auVar34,auVar99,ZEXT1632(auVar7));
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar90,ZEXT1632(auVar83));
        fVar192 = auVar84._0_4_;
        fVar193 = auVar84._4_4_;
        fVar194 = auVar84._8_4_;
        fVar195 = auVar84._12_4_;
        local_240._28_4_ = auVar102._28_4_;
        local_240._0_28_ =
             ZEXT1628(CONCAT412(auVar7._12_4_ * fVar195,
                                CONCAT48(auVar7._8_4_ * fVar194,
                                         CONCAT44(auVar7._4_4_ * fVar193,auVar7._0_4_ * fVar192))));
        auVar189 = ZEXT3264(local_240);
        auVar138._8_4_ = 3;
        auVar138._0_8_ = 0x300000003;
        auVar138._12_4_ = 3;
        auVar138._16_4_ = 3;
        auVar138._20_4_ = 3;
        auVar138._24_4_ = 3;
        auVar138._28_4_ = 3;
        auVar102 = vpermps_avx2(auVar138,ZEXT1632((undefined1  [16])aVar4));
        uVar145 = vcmpps_avx512vl(auVar102,local_240,2);
        fVar153 = (ray->super_RayK<1>).tfar;
        auVar23._4_4_ = fVar153;
        auVar23._0_4_ = fVar153;
        auVar23._8_4_ = fVar153;
        auVar23._12_4_ = fVar153;
        auVar23._16_4_ = fVar153;
        auVar23._20_4_ = fVar153;
        auVar23._24_4_ = fVar153;
        auVar23._28_4_ = fVar153;
        uVar19 = vcmpps_avx512vl(local_240,auVar23,2);
        bVar63 = (byte)uVar145 & (byte)uVar19 & bVar63;
        if (bVar63 != 0) {
          uVar64 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar64 = bVar63 & uVar64;
          if ((char)uVar64 != '\0') {
            fVar153 = auVar91._0_4_ * fVar192;
            fVar165 = auVar91._4_4_ * fVar193;
            auVar35._4_4_ = fVar165;
            auVar35._0_4_ = fVar153;
            fVar65 = auVar91._8_4_ * fVar194;
            auVar35._8_4_ = fVar65;
            fVar66 = auVar91._12_4_ * fVar195;
            auVar35._12_4_ = fVar66;
            fVar128 = auVar91._16_4_ * 0.0;
            auVar35._16_4_ = fVar128;
            fVar129 = auVar91._20_4_ * 0.0;
            auVar35._20_4_ = fVar129;
            fVar130 = auVar91._24_4_ * 0.0;
            auVar35._24_4_ = fVar130;
            auVar35._28_4_ = auVar91._28_4_;
            auVar139._8_4_ = 0x3f800000;
            auVar139._0_8_ = 0x3f8000003f800000;
            auVar139._12_4_ = 0x3f800000;
            auVar139._16_4_ = 0x3f800000;
            auVar139._20_4_ = 0x3f800000;
            auVar139._24_4_ = 0x3f800000;
            auVar139._28_4_ = 0x3f800000;
            auVar102 = vsubps_avx(auVar139,auVar35);
            local_280._0_4_ =
                 (float)((uint)(bVar53 & 1) * (int)fVar153 |
                        (uint)!(bool)(bVar53 & 1) * auVar102._0_4_);
            bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar11 * (int)fVar165 | (uint)!bVar11 * auVar102._4_4_);
            bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar11 * (int)fVar65 | (uint)!bVar11 * auVar102._8_4_);
            bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar11 * (int)fVar66 | (uint)!bVar11 * auVar102._12_4_)
            ;
            bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
            local_280._16_4_ =
                 (float)((uint)bVar11 * (int)fVar128 | (uint)!bVar11 * auVar102._16_4_);
            bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
            local_280._20_4_ =
                 (float)((uint)bVar11 * (int)fVar129 | (uint)!bVar11 * auVar102._20_4_);
            bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
            local_280._24_4_ =
                 (float)((uint)bVar11 * (int)fVar130 | (uint)!bVar11 * auVar102._24_4_);
            bVar11 = SUB81(uVar57 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar102._28_4_);
            auVar102 = vsubps_avx(ZEXT1632(auVar73),auVar96);
            auVar84 = vfmadd213ps_fma(auVar102,local_280,auVar96);
            fVar153 = local_518->depth_scale;
            auVar96._4_4_ = fVar153;
            auVar96._0_4_ = fVar153;
            auVar96._8_4_ = fVar153;
            auVar96._12_4_ = fVar153;
            auVar96._16_4_ = fVar153;
            auVar96._20_4_ = fVar153;
            auVar96._24_4_ = fVar153;
            auVar96._28_4_ = fVar153;
            auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                          CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                   CONCAT44(auVar84._4_4_ +
                                                                            auVar84._4_4_,
                                                                            auVar84._0_4_ +
                                                                            auVar84._0_4_)))),
                                       auVar96);
            uVar18 = vcmpps_avx512vl(local_240,auVar102,6);
            uVar64 = uVar64 & uVar18;
            bVar63 = (byte)uVar64;
            if (bVar63 != 0) {
              auVar163._0_4_ = auVar92._0_4_ * fVar192;
              auVar163._4_4_ = auVar92._4_4_ * fVar193;
              auVar163._8_4_ = auVar92._8_4_ * fVar194;
              auVar163._12_4_ = auVar92._12_4_ * fVar195;
              auVar163._16_4_ = auVar92._16_4_ * 0.0;
              auVar163._20_4_ = auVar92._20_4_ * 0.0;
              auVar163._24_4_ = auVar92._24_4_ * 0.0;
              auVar163._28_4_ = 0;
              auVar172._8_4_ = 0x3f800000;
              auVar172._0_8_ = 0x3f8000003f800000;
              auVar172._12_4_ = 0x3f800000;
              auVar172._16_4_ = 0x3f800000;
              auVar172._20_4_ = 0x3f800000;
              auVar172._24_4_ = 0x3f800000;
              auVar172._28_4_ = 0x3f800000;
              auVar102 = vsubps_avx(auVar172,auVar163);
              auVar114._0_4_ =
                   (uint)(bVar53 & 1) * (int)auVar163._0_4_ |
                   (uint)!(bool)(bVar53 & 1) * auVar102._0_4_;
              bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
              auVar114._4_4_ = (uint)bVar11 * (int)auVar163._4_4_ | (uint)!bVar11 * auVar102._4_4_;
              bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
              auVar114._8_4_ = (uint)bVar11 * (int)auVar163._8_4_ | (uint)!bVar11 * auVar102._8_4_;
              bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
              auVar114._12_4_ =
                   (uint)bVar11 * (int)auVar163._12_4_ | (uint)!bVar11 * auVar102._12_4_;
              bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
              auVar114._16_4_ =
                   (uint)bVar11 * (int)auVar163._16_4_ | (uint)!bVar11 * auVar102._16_4_;
              bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
              auVar114._20_4_ =
                   (uint)bVar11 * (int)auVar163._20_4_ | (uint)!bVar11 * auVar102._20_4_;
              bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
              auVar114._24_4_ =
                   (uint)bVar11 * (int)auVar163._24_4_ | (uint)!bVar11 * auVar102._24_4_;
              auVar114._28_4_ = (uint)!SUB81(uVar57 >> 7,0) * auVar102._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar114,auVar172,auVar24);
              local_220 = 0;
              local_21c = iVar8;
              local_210 = local_4b0._0_8_;
              uStack_208 = local_4b0._8_8_;
              local_200 = local_4c0._0_8_;
              uStack_1f8 = local_4c0._8_8_;
              local_1f0 = local_4d0._0_8_;
              uStack_1e8 = local_4d0._8_8_;
              local_1e0 = local_4e0;
              uStack_1d8 = uStack_4d8;
              if ((pGVar62->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar153 = 1.0 / auVar206._0_4_;
                local_1c0[0] = fVar153 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar153 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar153 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar153 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar153 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar153 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar153 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                auVar140._8_4_ = 0x7f800000;
                auVar140._0_8_ = 0x7f8000007f800000;
                auVar140._12_4_ = 0x7f800000;
                auVar140._16_4_ = 0x7f800000;
                auVar140._20_4_ = 0x7f800000;
                auVar140._24_4_ = 0x7f800000;
                auVar140._28_4_ = 0x7f800000;
                auVar102 = vblendmps_avx512vl(auVar140,local_240);
                auVar115._0_4_ =
                     (uint)(bVar63 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
                bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar64 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar64 >> 3) & 1);
                auVar115._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar64 >> 4) & 1);
                auVar115._16_4_ = (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar64 >> 5) & 1);
                auVar115._20_4_ = (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar64 >> 6) & 1);
                auVar115._24_4_ = (uint)bVar11 * auVar102._24_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = SUB81(uVar64 >> 7,0);
                auVar115._28_4_ = (uint)bVar11 * auVar102._28_4_ | (uint)!bVar11 * 0x7f800000;
                auVar102 = vshufps_avx(auVar115,auVar115,0xb1);
                auVar102 = vminps_avx(auVar115,auVar102);
                auVar103 = vshufpd_avx(auVar102,auVar102,5);
                auVar102 = vminps_avx(auVar102,auVar103);
                auVar103 = vpermpd_avx2(auVar102,0x4e);
                auVar102 = vminps_avx(auVar102,auVar103);
                uVar145 = vcmpps_avx512vl(auVar115,auVar102,0);
                uVar54 = (uint)uVar64;
                if ((bVar63 & (byte)uVar145) != 0) {
                  uVar54 = (uint)(bVar63 & (byte)uVar145);
                }
                uVar20 = 0;
                for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x80000000) {
                  uVar20 = uVar20 + 1;
                }
                uVar57 = (ulong)uVar20;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar62->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_3c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_3e0 = local_240;
                  local_440 = auVar97;
                  do {
                    local_494 = local_1c0[uVar57];
                    local_490 = *(undefined4 *)(local_1a0 + uVar57 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar57 * 4);
                    local_510.context = context->user;
                    fVar192 = 1.0 - local_494;
                    fVar153 = fVar192 * fVar192 * -3.0;
                    auVar179 = ZEXT464((uint)fVar153);
                    auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar192 * fVar192)),
                                              ZEXT416((uint)(local_494 * fVar192)),
                                              ZEXT416(0xc0000000));
                    auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar192)),
                                              ZEXT416((uint)(local_494 * local_494)),
                                              ZEXT416(0x40000000));
                    fVar192 = auVar84._0_4_ * 3.0;
                    fVar193 = auVar81._0_4_ * 3.0;
                    fVar194 = local_494 * local_494 * 3.0;
                    auVar185._0_4_ = fVar194 * (float)local_4e0._0_4_;
                    auVar185._4_4_ = fVar194 * (float)local_4e0._4_4_;
                    auVar185._8_4_ = fVar194 * (float)uStack_4d8;
                    auVar185._12_4_ = fVar194 * uStack_4d8._4_4_;
                    auVar186 = ZEXT1664(auVar185);
                    auVar161._4_4_ = fVar193;
                    auVar161._0_4_ = fVar193;
                    auVar161._8_4_ = fVar193;
                    auVar161._12_4_ = fVar193;
                    auVar84 = vfmadd132ps_fma(auVar161,auVar185,local_4d0);
                    auVar171._4_4_ = fVar192;
                    auVar171._0_4_ = fVar192;
                    auVar171._8_4_ = fVar192;
                    auVar171._12_4_ = fVar192;
                    auVar84 = vfmadd132ps_fma(auVar171,auVar84,local_4c0);
                    auVar162._4_4_ = fVar153;
                    auVar162._0_4_ = fVar153;
                    auVar162._8_4_ = fVar153;
                    auVar162._12_4_ = fVar153;
                    auVar84 = vfmadd132ps_fma(auVar162,auVar84,local_4b0);
                    local_4a0 = vmovlps_avx(auVar84);
                    local_498 = vextractps_avx(auVar84,2);
                    local_48c = (int)local_528;
                    local_488 = (int)local_530;
                    local_484 = (local_510.context)->instID[0];
                    local_480 = (local_510.context)->instPrimID[0];
                    local_53c = -1;
                    local_510.valid = &local_53c;
                    local_510.geometryUserPtr = pGVar62->userPtr;
                    local_510.ray = (RTCRayN *)ray;
                    local_510.hit = (RTCHitN *)&local_4a0;
                    local_510.N = 1;
                    if (pGVar62->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018a9bbe:
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar62->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar179 = ZEXT1664(auVar179._0_16_);
                        auVar186 = ZEXT1664(auVar186._0_16_);
                        (*p_Var10)(&local_510);
                        auVar189 = ZEXT3264(local_3e0);
                        auVar211 = ZEXT3264(local_440);
                        auVar214 = ZEXT1664(local_460);
                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar213 = ZEXT1664(auVar84);
                        if (*local_510.valid == 0) goto LAB_018a9c71;
                      }
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                           *(float *)local_510.hit;
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_510.hit + 4);
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_510.hit + 8);
                      *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                      *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                      *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                      *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                      *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                      *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                    }
                    else {
                      auVar179 = ZEXT464((uint)fVar153);
                      auVar186 = ZEXT1664(auVar185);
                      (*pGVar62->intersectionFilterN)(&local_510);
                      auVar189 = ZEXT3264(local_3e0);
                      auVar211 = ZEXT3264(local_440);
                      auVar214 = ZEXT1664(local_460);
                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar213 = ZEXT1664(auVar84);
                      if (*local_510.valid != 0) goto LAB_018a9bbe;
LAB_018a9c71:
                      (ray->super_RayK<1>).tfar = (float)local_3c0._0_4_;
                    }
                    auVar97 = auVar211._0_32_;
                    bVar63 = ~(byte)(1 << ((uint)uVar57 & 0x1f)) & (byte)uVar64;
                    fVar153 = (ray->super_RayK<1>).tfar;
                    auVar30._4_4_ = fVar153;
                    auVar30._0_4_ = fVar153;
                    auVar30._8_4_ = fVar153;
                    auVar30._12_4_ = fVar153;
                    auVar30._16_4_ = fVar153;
                    auVar30._20_4_ = fVar153;
                    auVar30._24_4_ = fVar153;
                    auVar30._28_4_ = fVar153;
                    uVar145 = vcmpps_avx512vl(auVar189._0_32_,auVar30,2);
                    prim = local_520;
                    if ((bVar63 & (byte)uVar145) == 0) goto LAB_018a8dd0;
                    local_3c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar63 = bVar63 & (byte)uVar145;
                    uVar64 = (ulong)bVar63;
                    auVar144._8_4_ = 0x7f800000;
                    auVar144._0_8_ = 0x7f8000007f800000;
                    auVar144._12_4_ = 0x7f800000;
                    auVar144._16_4_ = 0x7f800000;
                    auVar144._20_4_ = 0x7f800000;
                    auVar144._24_4_ = 0x7f800000;
                    auVar144._28_4_ = 0x7f800000;
                    auVar102 = vblendmps_avx512vl(auVar144,auVar189._0_32_);
                    auVar97._0_4_ =
                         (uint)(bVar63 & 1) * auVar102._0_4_ |
                         (uint)!(bool)(bVar63 & 1) * 0x7f800000;
                    bVar11 = (bool)(bVar63 >> 1 & 1);
                    auVar97._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar63 >> 2 & 1);
                    auVar97._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar63 >> 3 & 1);
                    auVar97._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar63 >> 4 & 1);
                    auVar97._16_4_ = (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar63 >> 5 & 1);
                    auVar97._20_4_ = (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar63 >> 6 & 1);
                    auVar97._24_4_ = (uint)bVar11 * auVar102._24_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar97._28_4_ =
                         (uint)(bVar63 >> 7) * auVar102._28_4_ |
                         (uint)!(bool)(bVar63 >> 7) * 0x7f800000;
                    auVar102 = vshufps_avx(auVar97,auVar97,0xb1);
                    auVar102 = vminps_avx(auVar97,auVar102);
                    auVar103 = vshufpd_avx(auVar102,auVar102,5);
                    auVar102 = vminps_avx(auVar102,auVar103);
                    auVar103 = vpermpd_avx2(auVar102,0x4e);
                    auVar102 = vminps_avx(auVar102,auVar103);
                    uVar145 = vcmpps_avx512vl(auVar97,auVar102,0);
                    bVar53 = (byte)uVar145 & bVar63;
                    if (bVar53 != 0) {
                      bVar63 = bVar53;
                    }
                    uVar55 = 0;
                    for (uVar56 = (uint)bVar63; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000
                        ) {
                      uVar55 = uVar55 + 1;
                    }
                    uVar57 = (ulong)uVar55;
                  } while( true );
                }
                fVar153 = local_1c0[uVar57];
                fVar192 = *(float *)(local_1a0 + uVar57 * 4);
                fVar194 = 1.0 - fVar153;
                fVar193 = fVar194 * fVar194 * -3.0;
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar194 * fVar194)),
                                          ZEXT416((uint)(fVar153 * fVar194)),ZEXT416(0xc0000000));
                auVar81 = vfmsub132ss_fma(ZEXT416((uint)(fVar153 * fVar194)),
                                          ZEXT416((uint)(fVar153 * fVar153)),ZEXT416(0x40000000));
                fVar194 = auVar84._0_4_ * 3.0;
                fVar195 = auVar81._0_4_ * 3.0;
                fVar165 = fVar153 * fVar153 * 3.0;
                auVar182._0_4_ = fVar165 * (float)local_4e0._0_4_;
                auVar182._4_4_ = fVar165 * (float)local_4e0._4_4_;
                auVar182._8_4_ = fVar165 * (float)uStack_4d8;
                auVar182._12_4_ = fVar165 * uStack_4d8._4_4_;
                auVar186 = ZEXT1664(auVar182);
                auVar155._4_4_ = fVar195;
                auVar155._0_4_ = fVar195;
                auVar155._8_4_ = fVar195;
                auVar155._12_4_ = fVar195;
                auVar84 = vfmadd132ps_fma(auVar155,auVar182,local_4d0);
                auVar168._4_4_ = fVar194;
                auVar168._0_4_ = fVar194;
                auVar168._8_4_ = fVar194;
                auVar168._12_4_ = fVar194;
                auVar84 = vfmadd132ps_fma(auVar168,auVar84,local_4c0);
                auVar156._4_4_ = fVar193;
                auVar156._0_4_ = fVar193;
                auVar156._8_4_ = fVar193;
                auVar156._12_4_ = fVar193;
                auVar179 = ZEXT464((uint)*(float *)(local_180 + uVar57 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar57 * 4);
                auVar84 = vfmadd132ps_fma(auVar156,auVar84,local_4b0);
                uVar145 = vmovlps_avx(auVar84);
                *(undefined8 *)&(ray->Ng).field_0 = uVar145;
                fVar193 = (float)vextractps_avx(auVar84,2);
                (ray->Ng).field_0.field_0.z = fVar193;
                ray->u = fVar153;
                ray->v = fVar192;
                ray->primID = uVar56;
                ray->geomID = uVar55;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                prim = local_520;
              }
            }
          }
        }
      }
    }
LAB_018a8dd0:
    if (8 < iVar8) {
      local_3c0 = vpbroadcastd_avx512vl();
      local_3e0._4_4_ = local_400._0_4_;
      local_3e0._0_4_ = local_400._0_4_;
      local_3e0._8_4_ = local_400._0_4_;
      local_3e0._12_4_ = local_400._0_4_;
      local_3e0._16_4_ = local_400._0_4_;
      local_3e0._20_4_ = local_400._0_4_;
      local_3e0._24_4_ = local_400._0_4_;
      local_3e0._28_4_ = local_400._0_4_;
      auVar141._8_4_ = 3;
      auVar141._0_8_ = 0x300000003;
      auVar141._12_4_ = 3;
      auVar141._16_4_ = 3;
      auVar141._20_4_ = 3;
      auVar141._24_4_ = 3;
      auVar141._28_4_ = 3;
      local_3a0 = vpermps_avx2(auVar141,local_3a0);
      local_100 = 1.0 / (float)local_420._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar58 = 8;
      local_440 = auVar97;
      lVar61 = local_538;
LAB_018a8e67:
      if (lVar58 < lVar61) {
        auVar102 = vpbroadcastd_avx512vl();
        auVar102 = vpor_avx2(auVar102,_DAT_01fb4ba0);
        uVar19 = vpcmpd_avx512vl(auVar102,local_3c0,1);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar58 * 4 + lVar59);
        auVar103 = *(undefined1 (*) [32])(lVar59 + 0x21fb768 + lVar58 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar59 + 0x21fbbec + lVar58 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar59 + 0x21fc070 + lVar58 * 4);
        auVar211._0_4_ = auVar100._0_4_ * (float)local_360._0_4_;
        auVar211._4_4_ = auVar100._4_4_ * (float)local_360._4_4_;
        auVar211._8_4_ = auVar100._8_4_ * fStack_358;
        auVar211._12_4_ = auVar100._12_4_ * fStack_354;
        auVar211._16_4_ = auVar100._16_4_ * fStack_350;
        auVar211._20_4_ = auVar100._20_4_ * fStack_34c;
        auVar211._28_36_ = auVar186._28_36_;
        auVar211._24_4_ = auVar100._24_4_ * fStack_348;
        auVar186._0_4_ = auVar100._0_4_ * (float)local_380._0_4_;
        auVar186._4_4_ = auVar100._4_4_ * (float)local_380._4_4_;
        auVar186._8_4_ = auVar100._8_4_ * fStack_378;
        auVar186._12_4_ = auVar100._12_4_ * fStack_374;
        auVar186._16_4_ = auVar100._16_4_ * fStack_370;
        auVar186._20_4_ = auVar100._20_4_ * fStack_36c;
        auVar186._28_36_ = auVar179._28_36_;
        auVar186._24_4_ = auVar100._24_4_ * fStack_368;
        auVar88 = vmulps_avx512vl(local_e0,auVar100);
        auVar89 = vfmadd231ps_avx512vl(auVar211._0_32_,auVar101,local_320);
        auVar90 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar101,local_340);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,local_2e0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_300);
        auVar99 = vfmadd231ps_avx512vl(auVar88,auVar103,local_a0);
        auVar84 = vfmadd231ps_fma(auVar89,auVar102,local_2a0);
        auVar186 = ZEXT1664(auVar84);
        auVar81 = vfmadd231ps_fma(auVar90,auVar102,local_2c0);
        auVar179 = ZEXT1664(auVar81);
        auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar58 * 4 + lVar59);
        auVar89 = *(undefined1 (*) [32])(lVar59 + 0x21fdb88 + lVar58 * 4);
        auVar92 = vfmadd231ps_avx512vl(auVar99,auVar102,local_80);
        auVar90 = *(undefined1 (*) [32])(lVar59 + 0x21fe00c + lVar58 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar59 + 0x21fe490 + lVar58 * 4);
        auVar190._0_4_ = auVar99._0_4_ * (float)local_360._0_4_;
        auVar190._4_4_ = auVar99._4_4_ * (float)local_360._4_4_;
        auVar190._8_4_ = auVar99._8_4_ * fStack_358;
        auVar190._12_4_ = auVar99._12_4_ * fStack_354;
        auVar190._16_4_ = auVar99._16_4_ * fStack_350;
        auVar190._20_4_ = auVar99._20_4_ * fStack_34c;
        auVar190._28_36_ = auVar189._28_36_;
        auVar190._24_4_ = auVar99._24_4_ * fStack_348;
        auVar36._4_4_ = auVar99._4_4_ * (float)local_380._4_4_;
        auVar36._0_4_ = auVar99._0_4_ * (float)local_380._0_4_;
        auVar36._8_4_ = auVar99._8_4_ * fStack_378;
        auVar36._12_4_ = auVar99._12_4_ * fStack_374;
        auVar36._16_4_ = auVar99._16_4_ * fStack_370;
        auVar36._20_4_ = auVar99._20_4_ * fStack_36c;
        auVar36._24_4_ = auVar99._24_4_ * fStack_368;
        auVar36._28_4_ = uStack_364;
        auVar93 = vmulps_avx512vl(local_e0,auVar99);
        auVar91 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar90,local_320);
        auVar94 = vfmadd231ps_avx512vl(auVar36,auVar90,local_340);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_2e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,local_300);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_a0);
        auVar7 = vfmadd231ps_fma(auVar91,auVar88,local_2a0);
        auVar189 = ZEXT1664(auVar7);
        auVar83 = vfmadd231ps_fma(auVar94,auVar88,local_2c0);
        auVar94 = vfmadd231ps_avx512vl(auVar93,auVar88,local_80);
        auVar95 = vmaxps_avx512vl(auVar92,auVar94);
        auVar93 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar84));
        auVar91 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar81));
        auVar96 = vmulps_avx512vl(ZEXT1632(auVar81),auVar93);
        auVar97 = vmulps_avx512vl(ZEXT1632(auVar84),auVar91);
        auVar96 = vsubps_avx512vl(auVar96,auVar97);
        auVar97 = vmulps_avx512vl(auVar91,auVar91);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar93);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        auVar95 = vmulps_avx512vl(auVar95,auVar97);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        uVar145 = vcmpps_avx512vl(auVar96,auVar95,2);
        bVar63 = (byte)uVar19 & (byte)uVar145;
        if (bVar63 != 0) {
          auVar99 = vmulps_avx512vl(local_160,auVar99);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_140,auVar99);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_120,auVar90);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_440,auVar89);
          auVar100 = vmulps_avx512vl(local_160,auVar100);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_140,auVar100);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_120,auVar101);
          auVar89 = vfmadd213ps_avx512vl(auVar102,local_440,auVar103);
          auVar102 = *(undefined1 (*) [32])(lVar59 + 0x21fc4f4 + lVar58 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar59 + 0x21fc978 + lVar58 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar59 + 0x21fcdfc + lVar58 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar59 + 0x21fd280 + lVar58 * 4);
          auVar90 = vmulps_avx512vl(_local_360,auVar100);
          auVar99 = vmulps_avx512vl(_local_380,auVar100);
          auVar100 = vmulps_avx512vl(local_160,auVar100);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar101,local_320);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_340);
          auVar101 = vfmadd231ps_avx512vl(auVar100,local_140,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar90,auVar103,local_2e0);
          auVar90 = vfmadd231ps_avx512vl(auVar99,auVar103,local_300);
          auVar103 = vfmadd231ps_avx512vl(auVar101,local_120,auVar103);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_2a0);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar102,local_2c0);
          auVar82 = vfmadd231ps_fma(auVar103,auVar102,local_440);
          auVar102 = *(undefined1 (*) [32])(lVar59 + 0x21fe914 + lVar58 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar59 + 0x21ff21c + lVar58 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar59 + 0x21ff6a0 + lVar58 * 4);
          auVar99 = vmulps_avx512vl(_local_360,auVar101);
          auVar95 = vmulps_avx512vl(_local_380,auVar101);
          auVar101 = vmulps_avx512vl(local_160,auVar101);
          auVar213 = ZEXT1664(auVar213._0_16_);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_320);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,local_340);
          auVar101 = vfmadd231ps_avx512vl(auVar101,local_140,auVar103);
          auVar214 = ZEXT1664(local_460);
          auVar103 = *(undefined1 (*) [32])(lVar59 + 0x21fed98 + lVar58 * 4);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_2e0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,local_300);
          auVar103 = vfmadd231ps_avx512vl(auVar101,local_120,auVar103);
          auVar101 = vfmadd231ps_avx512vl(auVar99,auVar102,local_2a0);
          auVar99 = vfmadd231ps_avx512vl(auVar95,auVar102,local_2c0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_440,auVar102);
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar100,auVar95);
          vandps_avx512vl(auVar90,auVar95);
          auVar102 = vmaxps_avx(auVar95,auVar95);
          vandps_avx512vl(ZEXT1632(auVar82),auVar95);
          auVar102 = vmaxps_avx(auVar102,auVar95);
          uVar57 = vcmpps_avx512vl(auVar102,local_3e0,1);
          bVar11 = (bool)((byte)uVar57 & 1);
          auVar116._0_4_ = (float)((uint)bVar11 * auVar93._0_4_ | (uint)!bVar11 * auVar100._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar100._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar100._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar100._12_4_)
          ;
          bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar11 * auVar93._16_4_ | (uint)!bVar11 * auVar100._16_4_)
          ;
          bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar11 * auVar93._20_4_ | (uint)!bVar11 * auVar100._20_4_)
          ;
          bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar11 * auVar93._24_4_ | (uint)!bVar11 * auVar100._24_4_)
          ;
          bVar11 = SUB81(uVar57 >> 7,0);
          auVar116._28_4_ = (uint)bVar11 * auVar93._28_4_ | (uint)!bVar11 * auVar100._28_4_;
          bVar11 = (bool)((byte)uVar57 & 1);
          auVar117._0_4_ = (float)((uint)bVar11 * auVar91._0_4_ | (uint)!bVar11 * auVar90._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar90._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar90._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar90._12_4_);
          bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar11 * auVar91._16_4_ | (uint)!bVar11 * auVar90._16_4_);
          bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar11 * auVar91._20_4_ | (uint)!bVar11 * auVar90._20_4_);
          bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar11 * auVar91._24_4_ | (uint)!bVar11 * auVar90._24_4_);
          bVar11 = SUB81(uVar57 >> 7,0);
          auVar117._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar90._28_4_;
          vandps_avx512vl(auVar101,auVar95);
          vandps_avx512vl(auVar99,auVar95);
          auVar102 = vmaxps_avx(auVar117,auVar117);
          vandps_avx512vl(auVar103,auVar95);
          auVar102 = vmaxps_avx(auVar102,auVar117);
          uVar57 = vcmpps_avx512vl(auVar102,local_3e0,1);
          bVar11 = (bool)((byte)uVar57 & 1);
          auVar118._0_4_ = (uint)bVar11 * auVar93._0_4_ | (uint)!bVar11 * auVar101._0_4_;
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar118._4_4_ = (uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar101._4_4_;
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar118._8_4_ = (uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar101._8_4_;
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar118._12_4_ = (uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar101._12_4_;
          bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
          auVar118._16_4_ = (uint)bVar11 * auVar93._16_4_ | (uint)!bVar11 * auVar101._16_4_;
          bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
          auVar118._20_4_ = (uint)bVar11 * auVar93._20_4_ | (uint)!bVar11 * auVar101._20_4_;
          bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
          auVar118._24_4_ = (uint)bVar11 * auVar93._24_4_ | (uint)!bVar11 * auVar101._24_4_;
          bVar11 = SUB81(uVar57 >> 7,0);
          auVar118._28_4_ = (uint)bVar11 * auVar93._28_4_ | (uint)!bVar11 * auVar101._28_4_;
          bVar11 = (bool)((byte)uVar57 & 1);
          auVar119._0_4_ = (float)((uint)bVar11 * auVar91._0_4_ | (uint)!bVar11 * auVar99._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar99._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar99._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar99._12_4_);
          bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar11 * auVar91._16_4_ | (uint)!bVar11 * auVar99._16_4_);
          bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar11 * auVar91._20_4_ | (uint)!bVar11 * auVar99._20_4_);
          bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar11 * auVar91._24_4_ | (uint)!bVar11 * auVar99._24_4_);
          bVar11 = SUB81(uVar57 >> 7,0);
          auVar119._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar99._28_4_;
          auVar199._8_4_ = 0x80000000;
          auVar199._0_8_ = 0x8000000080000000;
          auVar199._12_4_ = 0x80000000;
          auVar199._16_4_ = 0x80000000;
          auVar199._20_4_ = 0x80000000;
          auVar199._24_4_ = 0x80000000;
          auVar199._28_4_ = 0x80000000;
          auVar102 = vxorps_avx512vl(auVar118,auVar199);
          auVar87 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
          auVar103 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar87));
          auVar82 = vfmadd231ps_fma(auVar103,auVar117,auVar117);
          auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
          auVar210._8_4_ = 0xbf000000;
          auVar210._0_8_ = 0xbf000000bf000000;
          auVar210._12_4_ = 0xbf000000;
          auVar210._16_4_ = 0xbf000000;
          auVar210._20_4_ = 0xbf000000;
          auVar210._24_4_ = 0xbf000000;
          auVar210._28_4_ = 0xbf000000;
          fVar153 = auVar103._0_4_;
          fVar192 = auVar103._4_4_;
          fVar193 = auVar103._8_4_;
          fVar194 = auVar103._12_4_;
          fVar195 = auVar103._16_4_;
          fVar165 = auVar103._20_4_;
          fVar65 = auVar103._24_4_;
          auVar37._4_4_ = fVar192 * fVar192 * fVar192 * auVar82._4_4_ * -0.5;
          auVar37._0_4_ = fVar153 * fVar153 * fVar153 * auVar82._0_4_ * -0.5;
          auVar37._8_4_ = fVar193 * fVar193 * fVar193 * auVar82._8_4_ * -0.5;
          auVar37._12_4_ = fVar194 * fVar194 * fVar194 * auVar82._12_4_ * -0.5;
          auVar37._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
          auVar37._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar37._24_4_ = fVar65 * fVar65 * fVar65 * -0.0;
          auVar37._28_4_ = auVar117._28_4_;
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar103 = vfmadd231ps_avx512vl(auVar37,auVar101,auVar103);
          auVar38._4_4_ = auVar117._4_4_ * auVar103._4_4_;
          auVar38._0_4_ = auVar117._0_4_ * auVar103._0_4_;
          auVar38._8_4_ = auVar117._8_4_ * auVar103._8_4_;
          auVar38._12_4_ = auVar117._12_4_ * auVar103._12_4_;
          auVar38._16_4_ = auVar117._16_4_ * auVar103._16_4_;
          auVar38._20_4_ = auVar117._20_4_ * auVar103._20_4_;
          auVar38._24_4_ = auVar117._24_4_ * auVar103._24_4_;
          auVar38._28_4_ = 0;
          auVar39._4_4_ = auVar103._4_4_ * -auVar116._4_4_;
          auVar39._0_4_ = auVar103._0_4_ * -auVar116._0_4_;
          auVar39._8_4_ = auVar103._8_4_ * -auVar116._8_4_;
          auVar39._12_4_ = auVar103._12_4_ * -auVar116._12_4_;
          auVar39._16_4_ = auVar103._16_4_ * -auVar116._16_4_;
          auVar39._20_4_ = auVar103._20_4_ * -auVar116._20_4_;
          auVar39._24_4_ = auVar103._24_4_ * -auVar116._24_4_;
          auVar39._28_4_ = auVar117._28_4_;
          auVar100 = vmulps_avx512vl(auVar103,ZEXT1632(auVar87));
          auVar99 = ZEXT1632(auVar87);
          auVar103 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar99);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar119,auVar119);
          auVar90 = vrsqrt14ps_avx512vl(auVar103);
          auVar103 = vmulps_avx512vl(auVar103,auVar210);
          fVar153 = auVar90._0_4_;
          fVar192 = auVar90._4_4_;
          fVar193 = auVar90._8_4_;
          fVar194 = auVar90._12_4_;
          fVar195 = auVar90._16_4_;
          fVar165 = auVar90._20_4_;
          fVar65 = auVar90._24_4_;
          auVar40._4_4_ = fVar192 * fVar192 * fVar192 * auVar103._4_4_;
          auVar40._0_4_ = fVar153 * fVar153 * fVar153 * auVar103._0_4_;
          auVar40._8_4_ = fVar193 * fVar193 * fVar193 * auVar103._8_4_;
          auVar40._12_4_ = fVar194 * fVar194 * fVar194 * auVar103._12_4_;
          auVar40._16_4_ = fVar195 * fVar195 * fVar195 * auVar103._16_4_;
          auVar40._20_4_ = fVar165 * fVar165 * fVar165 * auVar103._20_4_;
          auVar40._24_4_ = fVar65 * fVar65 * fVar65 * auVar103._24_4_;
          auVar40._28_4_ = auVar103._28_4_;
          auVar103 = vfmadd231ps_avx512vl(auVar40,auVar101,auVar90);
          auVar41._4_4_ = auVar119._4_4_ * auVar103._4_4_;
          auVar41._0_4_ = auVar119._0_4_ * auVar103._0_4_;
          auVar41._8_4_ = auVar119._8_4_ * auVar103._8_4_;
          auVar41._12_4_ = auVar119._12_4_ * auVar103._12_4_;
          auVar41._16_4_ = auVar119._16_4_ * auVar103._16_4_;
          auVar41._20_4_ = auVar119._20_4_ * auVar103._20_4_;
          auVar41._24_4_ = auVar119._24_4_ * auVar103._24_4_;
          auVar41._28_4_ = auVar90._28_4_;
          auVar42._4_4_ = auVar103._4_4_ * auVar102._4_4_;
          auVar42._0_4_ = auVar103._0_4_ * auVar102._0_4_;
          auVar42._8_4_ = auVar103._8_4_ * auVar102._8_4_;
          auVar42._12_4_ = auVar103._12_4_ * auVar102._12_4_;
          auVar42._16_4_ = auVar103._16_4_ * auVar102._16_4_;
          auVar42._20_4_ = auVar103._20_4_ * auVar102._20_4_;
          auVar42._24_4_ = auVar103._24_4_ * auVar102._24_4_;
          auVar42._28_4_ = auVar102._28_4_;
          auVar102 = vmulps_avx512vl(auVar103,auVar99);
          auVar82 = vfmadd213ps_fma(auVar38,auVar92,ZEXT1632(auVar84));
          auVar75 = vfmadd213ps_fma(auVar39,auVar92,ZEXT1632(auVar81));
          auVar101 = vfmadd213ps_avx512vl(auVar100,auVar92,auVar89);
          auVar90 = vfmadd213ps_avx512vl(auVar41,auVar94,ZEXT1632(auVar7));
          auVar74 = vfnmadd213ps_fma(auVar38,auVar92,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar42,auVar94,ZEXT1632(auVar83));
          auVar73 = vfnmadd213ps_fma(auVar39,auVar92,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar102,auVar94,auVar88);
          auVar79 = vfnmadd231ps_fma(auVar89,auVar92,auVar100);
          auVar77 = vfnmadd213ps_fma(auVar41,auVar94,ZEXT1632(auVar7));
          auVar78 = vfnmadd213ps_fma(auVar42,auVar94,ZEXT1632(auVar83));
          auVar80 = vfnmadd231ps_fma(auVar88,auVar94,auVar102);
          auVar88 = vsubps_avx512vl(auVar90,ZEXT1632(auVar74));
          auVar102 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar73));
          auVar103 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar79));
          auVar43._4_4_ = auVar102._4_4_ * auVar79._4_4_;
          auVar43._0_4_ = auVar102._0_4_ * auVar79._0_4_;
          auVar43._8_4_ = auVar102._8_4_ * auVar79._8_4_;
          auVar43._12_4_ = auVar102._12_4_ * auVar79._12_4_;
          auVar43._16_4_ = auVar102._16_4_ * 0.0;
          auVar43._20_4_ = auVar102._20_4_ * 0.0;
          auVar43._24_4_ = auVar102._24_4_ * 0.0;
          auVar43._28_4_ = auVar100._28_4_;
          auVar7 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar73),auVar103);
          auVar44._4_4_ = auVar103._4_4_ * auVar74._4_4_;
          auVar44._0_4_ = auVar103._0_4_ * auVar74._0_4_;
          auVar44._8_4_ = auVar103._8_4_ * auVar74._8_4_;
          auVar44._12_4_ = auVar103._12_4_ * auVar74._12_4_;
          auVar44._16_4_ = auVar103._16_4_ * 0.0;
          auVar44._20_4_ = auVar103._20_4_ * 0.0;
          auVar44._24_4_ = auVar103._24_4_ * 0.0;
          auVar44._28_4_ = auVar103._28_4_;
          auVar83 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar79),auVar88);
          auVar45._4_4_ = auVar73._4_4_ * auVar88._4_4_;
          auVar45._0_4_ = auVar73._0_4_ * auVar88._0_4_;
          auVar45._8_4_ = auVar73._8_4_ * auVar88._8_4_;
          auVar45._12_4_ = auVar73._12_4_ * auVar88._12_4_;
          auVar45._16_4_ = auVar88._16_4_ * 0.0;
          auVar45._20_4_ = auVar88._20_4_ * 0.0;
          auVar45._24_4_ = auVar88._24_4_ * 0.0;
          auVar45._28_4_ = auVar88._28_4_;
          auVar76 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar74),auVar102);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar99,ZEXT1632(auVar83));
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,ZEXT1632(auVar7));
          auVar96 = ZEXT1632(auVar87);
          uVar57 = vcmpps_avx512vl(auVar102,auVar96,2);
          bVar53 = (byte)uVar57;
          fVar129 = (float)((uint)(bVar53 & 1) * auVar82._0_4_ |
                           (uint)!(bool)(bVar53 & 1) * auVar77._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          fVar131 = (float)((uint)bVar11 * auVar82._4_4_ | (uint)!bVar11 * auVar77._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          fVar134 = (float)((uint)bVar11 * auVar82._8_4_ | (uint)!bVar11 * auVar77._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          fVar135 = (float)((uint)bVar11 * auVar82._12_4_ | (uint)!bVar11 * auVar77._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar134,CONCAT44(fVar131,fVar129))));
          fVar130 = (float)((uint)(bVar53 & 1) * auVar75._0_4_ |
                           (uint)!(bool)(bVar53 & 1) * auVar78._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          fVar133 = (float)((uint)bVar11 * auVar75._4_4_ | (uint)!bVar11 * auVar78._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          fVar132 = (float)((uint)bVar11 * auVar75._8_4_ | (uint)!bVar11 * auVar78._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          fVar136 = (float)((uint)bVar11 * auVar75._12_4_ | (uint)!bVar11 * auVar78._12_4_);
          auVar93 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar132,CONCAT44(fVar133,fVar130))));
          auVar120._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar80._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar80._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar80._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar80._12_4_)
          ;
          fVar153 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar101._16_4_);
          auVar120._16_4_ = fVar153;
          fVar192 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar101._20_4_);
          auVar120._20_4_ = fVar192;
          fVar193 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar101._24_4_);
          auVar120._24_4_ = fVar193;
          iVar1 = (uint)(byte)(uVar57 >> 7) * auVar101._28_4_;
          auVar120._28_4_ = iVar1;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar74),auVar90);
          auVar121._0_4_ =
               (uint)(bVar53 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar7._0_4_;
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar7._4_4_;
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar7._8_4_;
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar7._12_4_;
          auVar121._16_4_ = (uint)((byte)(uVar57 >> 4) & 1) * auVar102._16_4_;
          auVar121._20_4_ = (uint)((byte)(uVar57 >> 5) & 1) * auVar102._20_4_;
          auVar121._24_4_ = (uint)((byte)(uVar57 >> 6) & 1) * auVar102._24_4_;
          auVar121._28_4_ = (uint)(byte)(uVar57 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar84));
          auVar122._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar82._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar82._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar82._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar82._12_4_)
          ;
          fVar165 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar102._16_4_);
          auVar122._16_4_ = fVar165;
          fVar195 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar102._20_4_);
          auVar122._20_4_ = fVar195;
          fVar194 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar102._24_4_);
          auVar122._24_4_ = fVar194;
          auVar122._28_4_ = (uint)(byte)(uVar57 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar81));
          auVar123._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar75._0_4_);
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar75._4_4_);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar75._8_4_);
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar75._12_4_)
          ;
          fVar65 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar102._16_4_);
          auVar123._16_4_ = fVar65;
          fVar128 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar102._20_4_);
          auVar123._20_4_ = fVar128;
          fVar66 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar102._24_4_);
          auVar123._24_4_ = fVar66;
          iVar2 = (uint)(byte)(uVar57 >> 7) * auVar102._28_4_;
          auVar123._28_4_ = iVar2;
          auVar124._0_4_ =
               (uint)(bVar53 & 1) * (int)auVar74._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar90._0_4_;
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar11 * (int)auVar74._4_4_ | (uint)!bVar11 * auVar90._4_4_;
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar11 * (int)auVar74._8_4_ | (uint)!bVar11 * auVar90._8_4_;
          bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar11 * (int)auVar74._12_4_ | (uint)!bVar11 * auVar90._12_4_;
          auVar124._16_4_ = (uint)!(bool)((byte)(uVar57 >> 4) & 1) * auVar90._16_4_;
          auVar124._20_4_ = (uint)!(bool)((byte)(uVar57 >> 5) & 1) * auVar90._20_4_;
          auVar124._24_4_ = (uint)!(bool)((byte)(uVar57 >> 6) & 1) * auVar90._24_4_;
          auVar124._28_4_ = (uint)!SUB81(uVar57 >> 7,0) * auVar90._28_4_;
          bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar57 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar57 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar57 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar57 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar57 >> 3) & 1);
          auVar90 = vsubps_avx512vl(auVar124,auVar99);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar73._12_4_ |
                                                   (uint)!bVar15 * auVar84._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar73._8_4_ |
                                                            (uint)!bVar13 * auVar84._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar73._4_4_ |
                                                                     (uint)!bVar11 * auVar84._4_4_,
                                                                     (uint)(bVar53 & 1) *
                                                                     (int)auVar73._0_4_ |
                                                                     (uint)!(bool)(bVar53 & 1) *
                                                                     auVar84._0_4_)))),auVar93);
          auVar186 = ZEXT3264(auVar103);
          auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar79._12_4_ |
                                                   (uint)!bVar16 * auVar81._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar79._8_4_ |
                                                            (uint)!bVar14 * auVar81._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar79._4_4_ |
                                                                     (uint)!bVar12 * auVar81._4_4_,
                                                                     (uint)(bVar53 & 1) *
                                                                     (int)auVar79._0_4_ |
                                                                     (uint)!(bool)(bVar53 & 1) *
                                                                     auVar81._0_4_)))),auVar120);
          auVar100 = vsubps_avx(auVar99,auVar121);
          auVar189 = ZEXT3264(auVar100);
          auVar88 = vsubps_avx(auVar93,auVar122);
          auVar89 = vsubps_avx(auVar120,auVar123);
          auVar46._4_4_ = auVar101._4_4_ * fVar131;
          auVar46._0_4_ = auVar101._0_4_ * fVar129;
          auVar46._8_4_ = auVar101._8_4_ * fVar134;
          auVar46._12_4_ = auVar101._12_4_ * fVar135;
          auVar46._16_4_ = auVar101._16_4_ * 0.0;
          auVar46._20_4_ = auVar101._20_4_ * 0.0;
          auVar46._24_4_ = auVar101._24_4_ * 0.0;
          auVar46._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar46,auVar120,auVar90);
          auVar173._0_4_ = fVar130 * auVar90._0_4_;
          auVar173._4_4_ = fVar133 * auVar90._4_4_;
          auVar173._8_4_ = fVar132 * auVar90._8_4_;
          auVar173._12_4_ = fVar136 * auVar90._12_4_;
          auVar173._16_4_ = auVar90._16_4_ * 0.0;
          auVar173._20_4_ = auVar90._20_4_ * 0.0;
          auVar173._24_4_ = auVar90._24_4_ * 0.0;
          auVar173._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar173,auVar99,auVar103);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar96,ZEXT1632(auVar84));
          auVar177._0_4_ = auVar103._0_4_ * auVar120._0_4_;
          auVar177._4_4_ = auVar103._4_4_ * auVar120._4_4_;
          auVar177._8_4_ = auVar103._8_4_ * auVar120._8_4_;
          auVar177._12_4_ = auVar103._12_4_ * auVar120._12_4_;
          auVar177._16_4_ = auVar103._16_4_ * fVar153;
          auVar177._20_4_ = auVar103._20_4_ * fVar192;
          auVar177._24_4_ = auVar103._24_4_ * fVar193;
          auVar177._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar177,auVar93,auVar101);
          auVar91 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar84));
          auVar102 = vmulps_avx512vl(auVar89,auVar121);
          auVar102 = vfmsub231ps_avx512vl(auVar102,auVar100,auVar123);
          auVar47._4_4_ = auVar88._4_4_ * auVar123._4_4_;
          auVar47._0_4_ = auVar88._0_4_ * auVar123._0_4_;
          auVar47._8_4_ = auVar88._8_4_ * auVar123._8_4_;
          auVar47._12_4_ = auVar88._12_4_ * auVar123._12_4_;
          auVar47._16_4_ = auVar88._16_4_ * fVar65;
          auVar47._20_4_ = auVar88._20_4_ * fVar128;
          auVar47._24_4_ = auVar88._24_4_ * fVar66;
          auVar47._28_4_ = iVar2;
          auVar84 = vfmsub231ps_fma(auVar47,auVar122,auVar89);
          auVar178._0_4_ = auVar122._0_4_ * auVar100._0_4_;
          auVar178._4_4_ = auVar122._4_4_ * auVar100._4_4_;
          auVar178._8_4_ = auVar122._8_4_ * auVar100._8_4_;
          auVar178._12_4_ = auVar122._12_4_ * auVar100._12_4_;
          auVar178._16_4_ = fVar165 * auVar100._16_4_;
          auVar178._20_4_ = fVar195 * auVar100._20_4_;
          auVar178._24_4_ = fVar194 * auVar100._24_4_;
          auVar178._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar178,auVar88,auVar121);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar96,auVar102);
          auVar95 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar84));
          auVar179 = ZEXT3264(auVar95);
          auVar102 = vmaxps_avx(auVar91,auVar95);
          uVar145 = vcmpps_avx512vl(auVar102,auVar96,2);
          bVar63 = bVar63 & (byte)uVar145;
          if (bVar63 != 0) {
            auVar48._4_4_ = auVar89._4_4_ * auVar103._4_4_;
            auVar48._0_4_ = auVar89._0_4_ * auVar103._0_4_;
            auVar48._8_4_ = auVar89._8_4_ * auVar103._8_4_;
            auVar48._12_4_ = auVar89._12_4_ * auVar103._12_4_;
            auVar48._16_4_ = auVar89._16_4_ * auVar103._16_4_;
            auVar48._20_4_ = auVar89._20_4_ * auVar103._20_4_;
            auVar48._24_4_ = auVar89._24_4_ * auVar103._24_4_;
            auVar48._28_4_ = auVar102._28_4_;
            auVar83 = vfmsub231ps_fma(auVar48,auVar88,auVar101);
            auVar49._4_4_ = auVar101._4_4_ * auVar100._4_4_;
            auVar49._0_4_ = auVar101._0_4_ * auVar100._0_4_;
            auVar49._8_4_ = auVar101._8_4_ * auVar100._8_4_;
            auVar49._12_4_ = auVar101._12_4_ * auVar100._12_4_;
            auVar49._16_4_ = auVar101._16_4_ * auVar100._16_4_;
            auVar49._20_4_ = auVar101._20_4_ * auVar100._20_4_;
            auVar49._24_4_ = auVar101._24_4_ * auVar100._24_4_;
            auVar49._28_4_ = auVar101._28_4_;
            auVar7 = vfmsub231ps_fma(auVar49,auVar90,auVar89);
            auVar50._4_4_ = auVar88._4_4_ * auVar90._4_4_;
            auVar50._0_4_ = auVar88._0_4_ * auVar90._0_4_;
            auVar50._8_4_ = auVar88._8_4_ * auVar90._8_4_;
            auVar50._12_4_ = auVar88._12_4_ * auVar90._12_4_;
            auVar50._16_4_ = auVar88._16_4_ * auVar90._16_4_;
            auVar50._20_4_ = auVar88._20_4_ * auVar90._20_4_;
            auVar50._24_4_ = auVar88._24_4_ * auVar90._24_4_;
            auVar50._28_4_ = auVar88._28_4_;
            auVar82 = vfmsub231ps_fma(auVar50,auVar100,auVar103);
            auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar7),ZEXT1632(auVar82));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar83),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar102 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
            auVar25._8_4_ = 0x3f800000;
            auVar25._0_8_ = 0x3f8000003f800000;
            auVar25._12_4_ = 0x3f800000;
            auVar25._16_4_ = 0x3f800000;
            auVar25._20_4_ = 0x3f800000;
            auVar25._24_4_ = 0x3f800000;
            auVar25._28_4_ = 0x3f800000;
            auVar103 = vfnmadd213ps_avx512vl(auVar102,ZEXT1632(auVar81),auVar25);
            auVar84 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
            auVar186 = ZEXT1664(auVar84);
            auVar51._4_4_ = auVar82._4_4_ * auVar120._4_4_;
            auVar51._0_4_ = auVar82._0_4_ * auVar120._0_4_;
            auVar51._8_4_ = auVar82._8_4_ * auVar120._8_4_;
            auVar51._12_4_ = auVar82._12_4_ * auVar120._12_4_;
            auVar51._16_4_ = fVar153 * 0.0;
            auVar51._20_4_ = fVar192 * 0.0;
            auVar51._24_4_ = fVar193 * 0.0;
            auVar51._28_4_ = iVar1;
            auVar7 = vfmadd231ps_fma(auVar51,auVar93,ZEXT1632(auVar7));
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar99,ZEXT1632(auVar83));
            fVar192 = auVar84._0_4_;
            fVar193 = auVar84._4_4_;
            fVar194 = auVar84._8_4_;
            fVar195 = auVar84._12_4_;
            local_240._28_4_ = auVar102._28_4_;
            local_240._0_28_ =
                 ZEXT1628(CONCAT412(auVar7._12_4_ * fVar195,
                                    CONCAT48(auVar7._8_4_ * fVar194,
                                             CONCAT44(auVar7._4_4_ * fVar193,auVar7._0_4_ * fVar192)
                                            )));
            auVar189 = ZEXT3264(local_240);
            uVar145 = vcmpps_avx512vl(local_240,local_3a0,0xd);
            fVar153 = (ray->super_RayK<1>).tfar;
            auVar26._4_4_ = fVar153;
            auVar26._0_4_ = fVar153;
            auVar26._8_4_ = fVar153;
            auVar26._12_4_ = fVar153;
            auVar26._16_4_ = fVar153;
            auVar26._20_4_ = fVar153;
            auVar26._24_4_ = fVar153;
            auVar26._28_4_ = fVar153;
            uVar19 = vcmpps_avx512vl(local_240,auVar26,2);
            bVar63 = (byte)uVar145 & (byte)uVar19 & bVar63;
            if (bVar63 != 0) {
              uVar64 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar64 = bVar63 & uVar64;
              if ((char)uVar64 != '\0') {
                fVar153 = auVar91._0_4_ * fVar192;
                fVar165 = auVar91._4_4_ * fVar193;
                auVar52._4_4_ = fVar165;
                auVar52._0_4_ = fVar153;
                fVar65 = auVar91._8_4_ * fVar194;
                auVar52._8_4_ = fVar65;
                fVar66 = auVar91._12_4_ * fVar195;
                auVar52._12_4_ = fVar66;
                fVar128 = auVar91._16_4_ * 0.0;
                auVar52._16_4_ = fVar128;
                fVar129 = auVar91._20_4_ * 0.0;
                auVar52._20_4_ = fVar129;
                fVar130 = auVar91._24_4_ * 0.0;
                auVar52._24_4_ = fVar130;
                auVar52._28_4_ = auVar91._28_4_;
                auVar164._8_4_ = 0x3f800000;
                auVar164._0_8_ = 0x3f8000003f800000;
                auVar164._12_4_ = 0x3f800000;
                auVar164._16_4_ = 0x3f800000;
                auVar164._20_4_ = 0x3f800000;
                auVar164._24_4_ = 0x3f800000;
                auVar164._28_4_ = 0x3f800000;
                auVar102 = vsubps_avx(auVar164,auVar52);
                local_280._0_4_ =
                     (float)((uint)(bVar53 & 1) * (int)fVar153 |
                            (uint)!(bool)(bVar53 & 1) * auVar102._0_4_);
                bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar11 * (int)fVar165 | (uint)!bVar11 * auVar102._4_4_);
                bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar11 * (int)fVar65 | (uint)!bVar11 * auVar102._8_4_);
                bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar11 * (int)fVar66 | (uint)!bVar11 * auVar102._12_4_);
                bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar11 * (int)fVar128 | (uint)!bVar11 * auVar102._16_4_);
                bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar11 * (int)fVar129 | (uint)!bVar11 * auVar102._20_4_);
                bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar11 * (int)fVar130 | (uint)!bVar11 * auVar102._24_4_);
                bVar11 = SUB81(uVar57 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar102._28_4_);
                auVar102 = vsubps_avx(auVar94,auVar92);
                auVar84 = vfmadd213ps_fma(auVar102,local_280,auVar92);
                fVar153 = local_518->depth_scale;
                auVar27._4_4_ = fVar153;
                auVar27._0_4_ = fVar153;
                auVar27._8_4_ = fVar153;
                auVar27._12_4_ = fVar153;
                auVar27._16_4_ = fVar153;
                auVar27._20_4_ = fVar153;
                auVar27._24_4_ = fVar153;
                auVar27._28_4_ = fVar153;
                auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                              CONCAT48(auVar84._8_4_ + auVar84._8_4_
                                                                       ,CONCAT44(auVar84._4_4_ +
                                                                                 auVar84._4_4_,
                                                                                 auVar84._0_4_ +
                                                                                 auVar84._0_4_)))),
                                           auVar27);
                uVar18 = vcmpps_avx512vl(local_240,auVar102,6);
                uVar64 = uVar64 & uVar18;
                bVar63 = (byte)uVar64;
                if (bVar63 != 0) {
                  auVar152._0_4_ = auVar95._0_4_ * fVar192;
                  auVar152._4_4_ = auVar95._4_4_ * fVar193;
                  auVar152._8_4_ = auVar95._8_4_ * fVar194;
                  auVar152._12_4_ = auVar95._12_4_ * fVar195;
                  auVar152._16_4_ = auVar95._16_4_ * 0.0;
                  auVar152._20_4_ = auVar95._20_4_ * 0.0;
                  auVar152._24_4_ = auVar95._24_4_ * 0.0;
                  auVar152._28_4_ = 0;
                  auVar174._8_4_ = 0x3f800000;
                  auVar174._0_8_ = 0x3f8000003f800000;
                  auVar174._12_4_ = 0x3f800000;
                  auVar174._16_4_ = 0x3f800000;
                  auVar174._20_4_ = 0x3f800000;
                  auVar174._24_4_ = 0x3f800000;
                  auVar174._28_4_ = 0x3f800000;
                  auVar102 = vsubps_avx(auVar174,auVar152);
                  auVar125._0_4_ =
                       (uint)(bVar53 & 1) * (int)auVar152._0_4_ |
                       (uint)!(bool)(bVar53 & 1) * auVar102._0_4_;
                  bVar11 = (bool)((byte)(uVar57 >> 1) & 1);
                  auVar125._4_4_ =
                       (uint)bVar11 * (int)auVar152._4_4_ | (uint)!bVar11 * auVar102._4_4_;
                  bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
                  auVar125._8_4_ =
                       (uint)bVar11 * (int)auVar152._8_4_ | (uint)!bVar11 * auVar102._8_4_;
                  bVar11 = (bool)((byte)(uVar57 >> 3) & 1);
                  auVar125._12_4_ =
                       (uint)bVar11 * (int)auVar152._12_4_ | (uint)!bVar11 * auVar102._12_4_;
                  bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
                  auVar125._16_4_ =
                       (uint)bVar11 * (int)auVar152._16_4_ | (uint)!bVar11 * auVar102._16_4_;
                  bVar11 = (bool)((byte)(uVar57 >> 5) & 1);
                  auVar125._20_4_ =
                       (uint)bVar11 * (int)auVar152._20_4_ | (uint)!bVar11 * auVar102._20_4_;
                  bVar11 = (bool)((byte)(uVar57 >> 6) & 1);
                  auVar125._24_4_ =
                       (uint)bVar11 * (int)auVar152._24_4_ | (uint)!bVar11 * auVar102._24_4_;
                  auVar125._28_4_ = (uint)!SUB81(uVar57 >> 7,0) * auVar102._28_4_;
                  auVar28._8_4_ = 0x40000000;
                  auVar28._0_8_ = 0x4000000040000000;
                  auVar28._12_4_ = 0x40000000;
                  auVar28._16_4_ = 0x40000000;
                  auVar28._20_4_ = 0x40000000;
                  auVar28._24_4_ = 0x40000000;
                  auVar28._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar125,auVar174,auVar28);
                  local_220 = (int)lVar58;
                  local_21c = iVar8;
                  local_210 = local_4b0._0_8_;
                  uStack_208 = local_4b0._8_8_;
                  local_200 = local_4c0._0_8_;
                  uStack_1f8 = local_4c0._8_8_;
                  local_1f0 = local_4d0._0_8_;
                  uStack_1e8 = local_4d0._8_8_;
                  local_1e0 = local_4e0;
                  uStack_1d8 = uStack_4d8;
                  pGVar62 = (context->scene->geometries).items[local_530].ptr;
                  if ((pGVar62->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar84 = vcvtsi2ss_avx512f(auVar87,(int)lVar58);
                    fVar153 = auVar84._0_4_;
                    local_1c0[0] = (fVar153 + local_280._0_4_ + 0.0) * local_100;
                    local_1c0[1] = (fVar153 + local_280._4_4_ + 1.0) * fStack_fc;
                    local_1c0[2] = (fVar153 + local_280._8_4_ + 2.0) * fStack_f8;
                    local_1c0[3] = (fVar153 + local_280._12_4_ + 3.0) * fStack_f4;
                    fStack_1b0 = (fVar153 + local_280._16_4_ + 4.0) * fStack_f0;
                    fStack_1ac = (fVar153 + local_280._20_4_ + 5.0) * fStack_ec;
                    fStack_1a8 = (fVar153 + local_280._24_4_ + 6.0) * fStack_e8;
                    fStack_1a4 = fVar153 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    auVar142._8_4_ = 0x7f800000;
                    auVar142._0_8_ = 0x7f8000007f800000;
                    auVar142._12_4_ = 0x7f800000;
                    auVar142._16_4_ = 0x7f800000;
                    auVar142._20_4_ = 0x7f800000;
                    auVar142._24_4_ = 0x7f800000;
                    auVar142._28_4_ = 0x7f800000;
                    auVar102 = vblendmps_avx512vl(auVar142,local_240);
                    auVar126._0_4_ =
                         (uint)(bVar63 & 1) * auVar102._0_4_ |
                         (uint)!(bool)(bVar63 & 1) * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
                    auVar126._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar64 >> 2) & 1);
                    auVar126._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar64 >> 3) & 1);
                    auVar126._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar64 >> 4) & 1);
                    auVar126._16_4_ = (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar64 >> 5) & 1);
                    auVar126._20_4_ = (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar64 >> 6) & 1);
                    auVar126._24_4_ = (uint)bVar11 * auVar102._24_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = SUB81(uVar64 >> 7,0);
                    auVar126._28_4_ = (uint)bVar11 * auVar102._28_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar102 = vshufps_avx(auVar126,auVar126,0xb1);
                    auVar102 = vminps_avx(auVar126,auVar102);
                    auVar103 = vshufpd_avx(auVar102,auVar102,5);
                    auVar102 = vminps_avx(auVar102,auVar103);
                    auVar103 = vpermpd_avx2(auVar102,0x4e);
                    auVar102 = vminps_avx(auVar102,auVar103);
                    uVar145 = vcmpps_avx512vl(auVar126,auVar102,0);
                    uVar55 = (uint)uVar64;
                    if ((bVar63 & (byte)uVar145) != 0) {
                      uVar55 = (uint)(bVar63 & (byte)uVar145);
                    }
                    uVar56 = 0;
                    for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
                      uVar56 = uVar56 + 1;
                    }
                    uVar57 = (ulong)uVar56;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar62->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_420 = local_240;
                      local_468 = pGVar62;
                      do {
                        local_494 = local_1c0[uVar57];
                        local_490 = *(undefined4 *)(local_1a0 + uVar57 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar57 * 4);
                        local_510.context = context->user;
                        fVar192 = 1.0 - local_494;
                        fVar153 = fVar192 * fVar192 * -3.0;
                        auVar179 = ZEXT464((uint)fVar153);
                        auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar192 * fVar192)),
                                                  ZEXT416((uint)(local_494 * fVar192)),
                                                  ZEXT416(0xc0000000));
                        auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar192)),
                                                  ZEXT416((uint)(local_494 * local_494)),
                                                  ZEXT416(0x40000000));
                        fVar192 = auVar84._0_4_ * 3.0;
                        fVar193 = auVar81._0_4_ * 3.0;
                        fVar194 = local_494 * local_494 * 3.0;
                        auVar184._0_4_ = fVar194 * (float)local_4e0._0_4_;
                        auVar184._4_4_ = fVar194 * (float)local_4e0._4_4_;
                        auVar184._8_4_ = fVar194 * (float)uStack_4d8;
                        auVar184._12_4_ = fVar194 * uStack_4d8._4_4_;
                        auVar186 = ZEXT1664(auVar184);
                        auVar159._4_4_ = fVar193;
                        auVar159._0_4_ = fVar193;
                        auVar159._8_4_ = fVar193;
                        auVar159._12_4_ = fVar193;
                        auVar84 = vfmadd132ps_fma(auVar159,auVar184,local_4d0);
                        auVar170._4_4_ = fVar192;
                        auVar170._0_4_ = fVar192;
                        auVar170._8_4_ = fVar192;
                        auVar170._12_4_ = fVar192;
                        auVar84 = vfmadd132ps_fma(auVar170,auVar84,local_4c0);
                        auVar160._4_4_ = fVar153;
                        auVar160._0_4_ = fVar153;
                        auVar160._8_4_ = fVar153;
                        auVar160._12_4_ = fVar153;
                        auVar84 = vfmadd132ps_fma(auVar160,auVar84,local_4b0);
                        local_4a0 = vmovlps_avx(auVar84);
                        local_498 = vextractps_avx(auVar84,2);
                        local_48c = (int)local_528;
                        local_488 = (int)local_530;
                        local_484 = (local_510.context)->instID[0];
                        local_480 = (local_510.context)->instPrimID[0];
                        local_53c = -1;
                        local_510.valid = &local_53c;
                        local_510.geometryUserPtr = pGVar62->userPtr;
                        local_510.ray = (RTCRayN *)ray;
                        local_510.hit = (RTCHitN *)&local_4a0;
                        local_510.N = 1;
                        if (pGVar62->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018a98b4:
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar62->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar179 = ZEXT1664(auVar179._0_16_);
                            auVar186 = ZEXT1664(auVar186._0_16_);
                            (*p_Var10)(&local_510);
                            auVar189 = ZEXT3264(local_420);
                            pGVar62 = local_468;
                            if (*local_510.valid == 0) goto LAB_018a9952;
                          }
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                               *(float *)local_510.hit;
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_510.hit + 4);
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_510.hit + 8);
                          *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                          *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                          *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                          *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                          *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                          *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                        }
                        else {
                          auVar179 = ZEXT464((uint)fVar153);
                          auVar186 = ZEXT1664(auVar184);
                          (*pGVar62->intersectionFilterN)(&local_510);
                          auVar189 = ZEXT3264(local_420);
                          pGVar62 = local_468;
                          if (*local_510.valid != 0) goto LAB_018a98b4;
LAB_018a9952:
                          (ray->super_RayK<1>).tfar = (float)local_400._0_4_;
                          pGVar62 = local_468;
                        }
                        bVar63 = ~(byte)(1 << ((uint)uVar57 & 0x1f)) & (byte)uVar64;
                        fVar153 = (ray->super_RayK<1>).tfar;
                        auVar29._4_4_ = fVar153;
                        auVar29._0_4_ = fVar153;
                        auVar29._8_4_ = fVar153;
                        auVar29._12_4_ = fVar153;
                        auVar29._16_4_ = fVar153;
                        auVar29._20_4_ = fVar153;
                        auVar29._24_4_ = fVar153;
                        auVar29._28_4_ = fVar153;
                        uVar145 = vcmpps_avx512vl(auVar189._0_32_,auVar29,2);
                        if ((bVar63 & (byte)uVar145) == 0) goto LAB_018a99f3;
                        local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar63 = bVar63 & (byte)uVar145;
                        uVar64 = (ulong)bVar63;
                        auVar143._8_4_ = 0x7f800000;
                        auVar143._0_8_ = 0x7f8000007f800000;
                        auVar143._12_4_ = 0x7f800000;
                        auVar143._16_4_ = 0x7f800000;
                        auVar143._20_4_ = 0x7f800000;
                        auVar143._24_4_ = 0x7f800000;
                        auVar143._28_4_ = 0x7f800000;
                        auVar102 = vblendmps_avx512vl(auVar143,auVar189._0_32_);
                        auVar127._0_4_ =
                             (uint)(bVar63 & 1) * auVar102._0_4_ |
                             (uint)!(bool)(bVar63 & 1) * 0x7f800000;
                        bVar11 = (bool)(bVar63 >> 1 & 1);
                        auVar127._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar63 >> 2 & 1);
                        auVar127._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar63 >> 3 & 1);
                        auVar127._12_4_ =
                             (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar63 >> 4 & 1);
                        auVar127._16_4_ =
                             (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar63 >> 5 & 1);
                        auVar127._20_4_ =
                             (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar63 >> 6 & 1);
                        auVar127._24_4_ =
                             (uint)bVar11 * auVar102._24_4_ | (uint)!bVar11 * 0x7f800000;
                        auVar127._28_4_ =
                             (uint)(bVar63 >> 7) * auVar102._28_4_ |
                             (uint)!(bool)(bVar63 >> 7) * 0x7f800000;
                        auVar102 = vshufps_avx(auVar127,auVar127,0xb1);
                        auVar102 = vminps_avx(auVar127,auVar102);
                        auVar103 = vshufpd_avx(auVar102,auVar102,5);
                        auVar102 = vminps_avx(auVar102,auVar103);
                        auVar103 = vpermpd_avx2(auVar102,0x4e);
                        auVar102 = vminps_avx(auVar102,auVar103);
                        uVar145 = vcmpps_avx512vl(auVar127,auVar102,0);
                        bVar53 = (byte)uVar145 & bVar63;
                        if (bVar53 != 0) {
                          bVar63 = bVar53;
                        }
                        uVar55 = 0;
                        for (uVar56 = (uint)bVar63; (uVar56 & 1) == 0;
                            uVar56 = uVar56 >> 1 | 0x80000000) {
                          uVar55 = uVar55 + 1;
                        }
                        uVar57 = (ulong)uVar55;
                      } while( true );
                    }
                    fVar153 = local_1c0[uVar57];
                    fVar192 = *(float *)(local_1a0 + uVar57 * 4);
                    fVar194 = 1.0 - fVar153;
                    fVar193 = fVar194 * fVar194 * -3.0;
                    auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar194 * fVar194)),
                                              ZEXT416((uint)(fVar153 * fVar194)),ZEXT416(0xc0000000)
                                             );
                    auVar81 = vfmsub132ss_fma(ZEXT416((uint)(fVar153 * fVar194)),
                                              ZEXT416((uint)(fVar153 * fVar153)),ZEXT416(0x40000000)
                                             );
                    fVar194 = auVar84._0_4_ * 3.0;
                    fVar195 = auVar81._0_4_ * 3.0;
                    fVar165 = fVar153 * fVar153 * 3.0;
                    auVar183._0_4_ = fVar165 * (float)local_4e0._0_4_;
                    auVar183._4_4_ = fVar165 * (float)local_4e0._4_4_;
                    auVar183._8_4_ = fVar165 * (float)uStack_4d8;
                    auVar183._12_4_ = fVar165 * uStack_4d8._4_4_;
                    auVar186 = ZEXT1664(auVar183);
                    auVar157._4_4_ = fVar195;
                    auVar157._0_4_ = fVar195;
                    auVar157._8_4_ = fVar195;
                    auVar157._12_4_ = fVar195;
                    auVar84 = vfmadd132ps_fma(auVar157,auVar183,local_4d0);
                    auVar169._4_4_ = fVar194;
                    auVar169._0_4_ = fVar194;
                    auVar169._8_4_ = fVar194;
                    auVar169._12_4_ = fVar194;
                    auVar84 = vfmadd132ps_fma(auVar169,auVar84,local_4c0);
                    auVar158._4_4_ = fVar193;
                    auVar158._0_4_ = fVar193;
                    auVar158._8_4_ = fVar193;
                    auVar158._12_4_ = fVar193;
                    auVar179 = ZEXT464((uint)*(float *)(local_180 + uVar57 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar57 * 4);
                    auVar84 = vfmadd132ps_fma(auVar158,auVar84,local_4b0);
                    uVar145 = vmovlps_avx(auVar84);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar145;
                    fVar193 = (float)vextractps_avx(auVar84,2);
                    (ray->Ng).field_0.field_0.z = fVar193;
                    ray->u = fVar153;
                    ray->v = fVar192;
                    ray->primID = (uint)local_528;
                    ray->geomID = (uint)local_530;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    lVar61 = local_538;
                  }
                }
              }
            }
          }
        }
        goto LAB_018a971f;
      }
    }
    fVar153 = (ray->super_RayK<1>).tfar;
    auVar21._4_4_ = fVar153;
    auVar21._0_4_ = fVar153;
    auVar21._8_4_ = fVar153;
    auVar21._12_4_ = fVar153;
    uVar145 = vcmpps_avx512vl(auVar214._0_16_,auVar21,2);
    uVar57 = (ulong)((uint)local_448 & (uint)local_448 + 0xf & (uint)uVar145);
  } while( true );
LAB_018a99f3:
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar213 = ZEXT1664(auVar84);
  auVar214 = ZEXT1664(local_460);
  lVar61 = local_538;
  prim = local_520;
LAB_018a971f:
  lVar58 = lVar58 + 8;
  goto LAB_018a8e67;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }